

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [12];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  uint uVar74;
  uint uVar75;
  long lVar76;
  ulong uVar77;
  uint uVar78;
  ulong uVar79;
  uint uVar80;
  ulong uVar81;
  bool bVar82;
  vint4 bi_2;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar107;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  vint4 bi_1;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar110 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  vint4 ai;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar149;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar142 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar150;
  float fVar168;
  float fVar169;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar170;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar171;
  vint4 bi;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [28];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar189;
  float fVar206;
  float fVar208;
  vint4 ai_2;
  undefined1 auVar190 [16];
  float fVar210;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar207;
  float fVar209;
  float fVar211;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar215;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar205 [64];
  float fVar216;
  float fVar225;
  float fVar229;
  vint4 ai_1;
  undefined1 auVar217 [16];
  float fVar233;
  undefined1 auVar218 [16];
  float fVar226;
  float fVar227;
  float fVar230;
  float fVar231;
  float fVar234;
  float fVar235;
  float fVar238;
  float fVar242;
  float fVar246;
  undefined1 auVar221 [32];
  float fVar239;
  float fVar243;
  float fVar247;
  undefined1 auVar222 [32];
  float fVar228;
  float fVar232;
  float fVar236;
  float fVar240;
  float fVar244;
  float fVar248;
  undefined1 auVar223 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar237;
  float fVar241;
  float fVar245;
  undefined1 auVar224 [64];
  float fVar249;
  float fVar257;
  float fVar258;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar259;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar256 [64];
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar306 [16];
  float fVar311;
  float fVar312;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [64];
  float fVar313;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar314 [64];
  float fVar322;
  float fVar333;
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar326 [64];
  float fVar334;
  float fVar335;
  float fVar342;
  float fVar344;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  float fVar343;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [28];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar359;
  float fVar363;
  float fVar364;
  undefined1 auVar360 [16];
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c48;
  float local_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float local_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  RTCFilterFunctionNArguments local_ab0;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 (*local_a48) [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8c8;
  ulong local_8c0;
  undefined1 auStack_8b8 [24];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  RTCHitN local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined8 local_770;
  undefined8 uStack_768;
  undefined1 local_760 [16];
  uint local_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  undefined1 auStack_740 [16];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar341 [64];
  
  PVar2 = prim[1];
  uVar81 = (ulong)(byte)PVar2;
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar109 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar109 = vinsertps_avx(auVar109,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar81 * 0x19 + 6));
  fVar189 = *(float *)(prim + uVar81 * 0x19 + 0x12);
  auVar88._0_4_ = fVar189 * auVar7._0_4_;
  auVar88._4_4_ = fVar189 * auVar7._4_4_;
  auVar88._8_4_ = fVar189 * auVar7._8_4_;
  auVar88._12_4_ = fVar189 * auVar7._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar250._0_4_ = fVar189 * auVar109._0_4_;
  auVar250._4_4_ = fVar189 * auVar109._4_4_;
  auVar250._8_4_ = fVar189 * auVar109._8_4_;
  auVar250._12_4_ = fVar189 * auVar109._12_4_;
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar155 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xc + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xd + 6)));
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x12 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x13 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x14 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar83 = vshufps_avx(auVar250,auVar250,0);
  auVar89 = vshufps_avx(auVar250,auVar250,0x55);
  auVar111 = vshufps_avx(auVar250,auVar250,0xaa);
  fVar189 = auVar111._0_4_;
  fVar150 = auVar111._4_4_;
  fVar206 = auVar111._8_4_;
  fVar168 = auVar111._12_4_;
  fVar216 = auVar89._0_4_;
  fVar225 = auVar89._4_4_;
  fVar229 = auVar89._8_4_;
  fVar233 = auVar89._12_4_;
  fVar208 = auVar83._0_4_;
  fVar169 = auVar83._4_4_;
  fVar210 = auVar83._8_4_;
  fVar170 = auVar83._12_4_;
  auVar336._0_4_ = fVar208 * auVar7._0_4_ + fVar216 * auVar109._0_4_ + fVar189 * auVar8._0_4_;
  auVar336._4_4_ = fVar169 * auVar7._4_4_ + fVar225 * auVar109._4_4_ + fVar150 * auVar8._4_4_;
  auVar336._8_4_ = fVar210 * auVar7._8_4_ + fVar229 * auVar109._8_4_ + fVar206 * auVar8._8_4_;
  auVar336._12_4_ = fVar170 * auVar7._12_4_ + fVar233 * auVar109._12_4_ + fVar168 * auVar8._12_4_;
  auVar354._0_4_ = fVar208 * auVar9._0_4_ + fVar216 * auVar155._0_4_ + auVar10._0_4_ * fVar189;
  auVar354._4_4_ = fVar169 * auVar9._4_4_ + fVar225 * auVar155._4_4_ + auVar10._4_4_ * fVar150;
  auVar354._8_4_ = fVar210 * auVar9._8_4_ + fVar229 * auVar155._8_4_ + auVar10._8_4_ * fVar206;
  auVar354._12_4_ = fVar170 * auVar9._12_4_ + fVar233 * auVar155._12_4_ + auVar10._12_4_ * fVar168;
  auVar251._0_4_ = fVar208 * auVar84._0_4_ + fVar216 * auVar85._0_4_ + auVar108._0_4_ * fVar189;
  auVar251._4_4_ = fVar169 * auVar84._4_4_ + fVar225 * auVar85._4_4_ + auVar108._4_4_ * fVar150;
  auVar251._8_4_ = fVar210 * auVar84._8_4_ + fVar229 * auVar85._8_4_ + auVar108._8_4_ * fVar206;
  auVar251._12_4_ = fVar170 * auVar84._12_4_ + fVar233 * auVar85._12_4_ + auVar108._12_4_ * fVar168;
  auVar83 = vshufps_avx(auVar88,auVar88,0);
  auVar89 = vshufps_avx(auVar88,auVar88,0x55);
  auVar111 = vshufps_avx(auVar88,auVar88,0xaa);
  fVar189 = auVar111._0_4_;
  fVar150 = auVar111._4_4_;
  fVar206 = auVar111._8_4_;
  fVar168 = auVar111._12_4_;
  fVar216 = auVar89._0_4_;
  fVar225 = auVar89._4_4_;
  fVar229 = auVar89._8_4_;
  fVar233 = auVar89._12_4_;
  fVar208 = auVar83._0_4_;
  fVar169 = auVar83._4_4_;
  fVar210 = auVar83._8_4_;
  fVar170 = auVar83._12_4_;
  auVar172._0_4_ = fVar208 * auVar7._0_4_ + fVar216 * auVar109._0_4_ + fVar189 * auVar8._0_4_;
  auVar172._4_4_ = fVar169 * auVar7._4_4_ + fVar225 * auVar109._4_4_ + fVar150 * auVar8._4_4_;
  auVar172._8_4_ = fVar210 * auVar7._8_4_ + fVar229 * auVar109._8_4_ + fVar206 * auVar8._8_4_;
  auVar172._12_4_ = fVar170 * auVar7._12_4_ + fVar233 * auVar109._12_4_ + fVar168 * auVar8._12_4_;
  auVar89._0_4_ = fVar208 * auVar9._0_4_ + auVar10._0_4_ * fVar189 + fVar216 * auVar155._0_4_;
  auVar89._4_4_ = fVar169 * auVar9._4_4_ + auVar10._4_4_ * fVar150 + fVar225 * auVar155._4_4_;
  auVar89._8_4_ = fVar210 * auVar9._8_4_ + auVar10._8_4_ * fVar206 + fVar229 * auVar155._8_4_;
  auVar89._12_4_ = fVar170 * auVar9._12_4_ + auVar10._12_4_ * fVar168 + fVar233 * auVar155._12_4_;
  auVar83._0_4_ = fVar216 * auVar85._0_4_ + auVar108._0_4_ * fVar189 + fVar208 * auVar84._0_4_;
  auVar83._4_4_ = fVar225 * auVar85._4_4_ + auVar108._4_4_ * fVar150 + fVar169 * auVar84._4_4_;
  auVar83._8_4_ = fVar229 * auVar85._8_4_ + auVar108._8_4_ * fVar206 + fVar210 * auVar84._8_4_;
  auVar83._12_4_ = fVar233 * auVar85._12_4_ + auVar108._12_4_ * fVar168 + fVar170 * auVar84._12_4_;
  auVar217._8_4_ = 0x7fffffff;
  auVar217._0_8_ = 0x7fffffff7fffffff;
  auVar217._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar336,auVar217);
  auVar91._8_4_ = 0x219392ef;
  auVar91._0_8_ = 0x219392ef219392ef;
  auVar91._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar91,1);
  auVar109 = vblendvps_avx(auVar336,auVar91,auVar7);
  auVar7 = vandps_avx(auVar354,auVar217);
  auVar7 = vcmpps_avx(auVar7,auVar91,1);
  auVar8 = vblendvps_avx(auVar354,auVar91,auVar7);
  auVar7 = vandps_avx(auVar251,auVar217);
  auVar7 = vcmpps_avx(auVar7,auVar91,1);
  auVar7 = vblendvps_avx(auVar251,auVar91,auVar7);
  auVar9 = vrcpps_avx(auVar109);
  fVar216 = auVar9._0_4_;
  auVar111._0_4_ = fVar216 * auVar109._0_4_;
  fVar225 = auVar9._4_4_;
  auVar111._4_4_ = fVar225 * auVar109._4_4_;
  fVar229 = auVar9._8_4_;
  auVar111._8_4_ = fVar229 * auVar109._8_4_;
  fVar233 = auVar9._12_4_;
  auVar111._12_4_ = fVar233 * auVar109._12_4_;
  auVar252._8_4_ = 0x3f800000;
  auVar252._0_8_ = 0x3f8000003f800000;
  auVar252._12_4_ = 0x3f800000;
  auVar109 = vsubps_avx(auVar252,auVar111);
  fVar216 = fVar216 + fVar216 * auVar109._0_4_;
  fVar225 = fVar225 + fVar225 * auVar109._4_4_;
  fVar229 = fVar229 + fVar229 * auVar109._8_4_;
  fVar233 = fVar233 + fVar233 * auVar109._12_4_;
  auVar109 = vrcpps_avx(auVar8);
  fVar189 = auVar109._0_4_;
  auVar190._0_4_ = fVar189 * auVar8._0_4_;
  fVar206 = auVar109._4_4_;
  auVar190._4_4_ = fVar206 * auVar8._4_4_;
  fVar208 = auVar109._8_4_;
  auVar190._8_4_ = fVar208 * auVar8._8_4_;
  fVar210 = auVar109._12_4_;
  auVar190._12_4_ = fVar210 * auVar8._12_4_;
  auVar109 = vsubps_avx(auVar252,auVar190);
  fVar189 = fVar189 + fVar189 * auVar109._0_4_;
  fVar206 = fVar206 + fVar206 * auVar109._4_4_;
  fVar208 = fVar208 + fVar208 * auVar109._8_4_;
  fVar210 = fVar210 + fVar210 * auVar109._12_4_;
  auVar109 = vrcpps_avx(auVar7);
  fVar150 = auVar109._0_4_;
  auVar151._0_4_ = fVar150 * auVar7._0_4_;
  fVar168 = auVar109._4_4_;
  auVar151._4_4_ = fVar168 * auVar7._4_4_;
  fVar169 = auVar109._8_4_;
  auVar151._8_4_ = fVar169 * auVar7._8_4_;
  fVar170 = auVar109._12_4_;
  auVar151._12_4_ = fVar170 * auVar7._12_4_;
  auVar7 = vsubps_avx(auVar252,auVar151);
  fVar150 = fVar150 + fVar150 * auVar7._0_4_;
  fVar168 = fVar168 + fVar168 * auVar7._4_4_;
  fVar169 = fVar169 + fVar169 * auVar7._8_4_;
  fVar170 = fVar170 + fVar170 * auVar7._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vsubps_avx(auVar7,auVar172);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar109);
  auVar135._0_4_ = fVar216 * auVar8._0_4_;
  auVar135._4_4_ = fVar225 * auVar8._4_4_;
  auVar135._8_4_ = fVar229 * auVar8._8_4_;
  auVar135._12_4_ = fVar233 * auVar8._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar172);
  auVar173._0_4_ = fVar216 * auVar7._0_4_;
  auVar173._4_4_ = fVar225 * auVar7._4_4_;
  auVar173._8_4_ = fVar229 * auVar7._8_4_;
  auVar173._12_4_ = fVar233 * auVar7._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar81 * 0xe + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar109 = vsubps_avx(auVar7,auVar89);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar7 = vpmovsxwd_avx(auVar9);
  auVar218._0_4_ = auVar109._0_4_ * fVar189;
  auVar218._4_4_ = auVar109._4_4_ * fVar206;
  auVar218._8_4_ = auVar109._8_4_ * fVar208;
  auVar218._12_4_ = auVar109._12_4_ * fVar210;
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar89);
  auVar108._0_4_ = fVar189 * auVar7._0_4_;
  auVar108._4_4_ = fVar206 * auVar7._4_4_;
  auVar108._8_4_ = fVar208 * auVar7._8_4_;
  auVar108._12_4_ = fVar210 * auVar7._12_4_;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar81 * 0x15 + 6);
  auVar7 = vpmovsxwd_avx(auVar155);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar83);
  auVar191._0_4_ = auVar7._0_4_ * fVar150;
  auVar191._4_4_ = auVar7._4_4_ * fVar168;
  auVar191._8_4_ = auVar7._8_4_ * fVar169;
  auVar191._12_4_ = auVar7._12_4_ * fVar170;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar83);
  auVar84._0_4_ = auVar7._0_4_ * fVar150;
  auVar84._4_4_ = auVar7._4_4_ * fVar168;
  auVar84._8_4_ = auVar7._8_4_ * fVar169;
  auVar84._12_4_ = auVar7._12_4_ * fVar170;
  auVar7 = vpminsd_avx(auVar135,auVar173);
  auVar109 = vpminsd_avx(auVar218,auVar108);
  auVar7 = vmaxps_avx(auVar7,auVar109);
  auVar109 = vpminsd_avx(auVar191,auVar84);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar306._4_4_ = uVar1;
  auVar306._0_4_ = uVar1;
  auVar306._8_4_ = uVar1;
  auVar306._12_4_ = uVar1;
  auVar109 = vmaxps_avx(auVar109,auVar306);
  auVar7 = vmaxps_avx(auVar7,auVar109);
  local_640._0_4_ = auVar7._0_4_ * 0.99999964;
  local_640._4_4_ = auVar7._4_4_ * 0.99999964;
  local_640._8_4_ = auVar7._8_4_ * 0.99999964;
  local_640._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar135,auVar173);
  auVar109 = vpmaxsd_avx(auVar218,auVar108);
  auVar7 = vminps_avx(auVar7,auVar109);
  auVar109 = vpmaxsd_avx(auVar191,auVar84);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar136._4_4_ = uVar1;
  auVar136._0_4_ = uVar1;
  auVar136._8_4_ = uVar1;
  auVar136._12_4_ = uVar1;
  auVar109 = vminps_avx(auVar109,auVar136);
  auVar7 = vminps_avx(auVar7,auVar109);
  auVar85._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar85._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar85._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar85._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar7 = vpshufd_avx(ZEXT116((byte)PVar2),0);
  auVar109 = vpcmpgtd_avx(auVar7,_DAT_01f4ad30);
  auVar7 = vcmpps_avx(local_640,auVar85,2);
  auVar7 = vandps_avx(auVar7,auVar109);
  auVar122._16_16_ = mm_lookupmask_ps._240_16_;
  auVar122._0_16_ = mm_lookupmask_ps._240_16_;
  uVar74 = vmovmskps_avx(auVar7);
  local_560 = vblendps_avx(auVar122,ZEXT832(0) << 0x20,0x80);
  local_a48 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8c8 = prim;
LAB_0085514c:
  uVar81 = (ulong)uVar74;
  if (uVar81 == 0) {
    return;
  }
  lVar76 = 0;
  if (uVar81 != 0) {
    for (; (uVar74 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
    }
  }
  uVar81 = uVar81 - 1 & uVar81;
  uVar74 = *(uint *)(local_8c8 + 2);
  local_8c0 = (ulong)*(uint *)(local_8c8 + lVar76 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar74].ptr;
  uVar79 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8c0);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar5 = *(long *)&pGVar3[1].time_range.upper;
  auVar7 = *(undefined1 (*) [16])(lVar5 + (long)p_Var4 * uVar79);
  auVar109 = *(undefined1 (*) [16])(lVar5 + (uVar79 + 1) * (long)p_Var4);
  auVar8 = *(undefined1 (*) [16])(lVar5 + (uVar79 + 2) * (long)p_Var4);
  lVar6 = 0;
  if (uVar81 != 0) {
    for (; (uVar81 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  auVar9 = *(undefined1 (*) [16])(lVar5 + (uVar79 + 3) * (long)p_Var4);
  if (((uVar81 != 0) && (uVar79 = uVar81 - 1 & uVar81, uVar79 != 0)) && (lVar5 = 0, uVar79 != 0)) {
    for (; (uVar79 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  auVar155 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar10 = vinsertps_avx(auVar155,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar189 = *(float *)(ray + k * 4 + 0x40);
  auVar337._4_4_ = fVar189;
  auVar337._0_4_ = fVar189;
  auVar337._8_4_ = fVar189;
  auVar337._12_4_ = fVar189;
  fStack_890 = fVar189;
  _local_8a0 = auVar337;
  fStack_88c = fVar189;
  fStack_888 = fVar189;
  fStack_884 = fVar189;
  auVar341 = ZEXT3264(_local_8a0);
  fVar150 = *(float *)(ray + k * 4 + 0x50);
  auVar355._4_4_ = fVar150;
  auVar355._0_4_ = fVar150;
  auVar355._8_4_ = fVar150;
  auVar355._12_4_ = fVar150;
  fStack_6f0 = fVar150;
  _local_700 = auVar355;
  fStack_6ec = fVar150;
  fStack_6e8 = fVar150;
  fStack_6e4 = fVar150;
  auVar155 = vunpcklps_avx(auVar337,auVar355);
  fVar206 = *(float *)(ray + k * 4 + 0x60);
  auVar360._4_4_ = fVar206;
  auVar360._0_4_ = fVar206;
  auVar360._8_4_ = fVar206;
  auVar360._12_4_ = fVar206;
  fStack_710 = fVar206;
  _local_720 = auVar360;
  fStack_70c = fVar206;
  fStack_708 = fVar206;
  fStack_704 = fVar206;
  _local_9f0 = vinsertps_avx(auVar155,auVar360,0x28);
  auVar314 = ZEXT1664(_local_9f0);
  auVar86._0_4_ = (auVar7._0_4_ + auVar109._0_4_ + auVar8._0_4_ + auVar9._0_4_) * 0.25;
  auVar86._4_4_ = (auVar7._4_4_ + auVar109._4_4_ + auVar8._4_4_ + auVar9._4_4_) * 0.25;
  auVar86._8_4_ = (auVar7._8_4_ + auVar109._8_4_ + auVar8._8_4_ + auVar9._8_4_) * 0.25;
  auVar86._12_4_ = (auVar7._12_4_ + auVar109._12_4_ + auVar8._12_4_ + auVar9._12_4_) * 0.25;
  auVar155 = vsubps_avx(auVar86,auVar10);
  auVar155 = vdpps_avx(auVar155,_local_9f0,0x7f);
  local_a00 = vdpps_avx(_local_9f0,_local_9f0,0x7f);
  auVar326 = ZEXT1664(local_a00);
  auVar84 = vrcpss_avx(local_a00,local_a00);
  fVar168 = auVar155._0_4_ * auVar84._0_4_ * (2.0 - local_a00._0_4_ * auVar84._0_4_);
  auVar256 = ZEXT464((uint)fVar168);
  auVar84 = vshufps_avx(ZEXT416((uint)fVar168),ZEXT416((uint)fVar168),0);
  auVar192._0_4_ = auVar10._0_4_ + local_9f0._0_4_ * auVar84._0_4_;
  auVar192._4_4_ = auVar10._4_4_ + local_9f0._4_4_ * auVar84._4_4_;
  auVar192._8_4_ = auVar10._8_4_ + local_9f0._8_4_ * auVar84._8_4_;
  auVar192._12_4_ = auVar10._12_4_ + local_9f0._12_4_ * auVar84._12_4_;
  auVar155 = vblendps_avx(auVar192,_DAT_01f45a50,8);
  auVar205 = ZEXT1664(auVar155);
  auVar10 = vsubps_avx(auVar7,auVar155);
  auVar224 = ZEXT1664(auVar10);
  auVar85 = vsubps_avx(auVar8,auVar155);
  auVar108 = vsubps_avx(auVar109,auVar155);
  auVar9 = vsubps_avx(auVar9,auVar155);
  auVar7 = vshufps_avx(auVar10,auVar10,0);
  auVar109 = vshufps_avx(auVar10,auVar10,0x55);
  register0x00001250 = auVar109;
  _local_1e0 = auVar109;
  auVar109 = vshufps_avx(auVar10,auVar10,0xaa);
  register0x00001250 = auVar109;
  _local_200 = auVar109;
  auVar109 = vshufps_avx(auVar10,auVar10,0xff);
  register0x00001290 = auVar109;
  _local_220 = auVar109;
  auVar109 = vshufps_avx(auVar108,auVar108,0);
  register0x00001290 = auVar109;
  _local_240 = auVar109;
  auVar109 = vshufps_avx(auVar108,auVar108,0x55);
  register0x00001290 = auVar109;
  _local_260 = auVar109;
  auVar109 = vshufps_avx(auVar108,auVar108,0xaa);
  register0x00001290 = auVar109;
  _local_280 = auVar109;
  auVar109 = vshufps_avx(auVar108,auVar108,0xff);
  register0x00001290 = auVar109;
  _local_440 = auVar109;
  auVar109 = vshufps_avx(auVar85,auVar85,0);
  register0x00001290 = auVar109;
  _local_460 = auVar109;
  auVar109 = vshufps_avx(auVar85,auVar85,0x55);
  register0x00001290 = auVar109;
  _local_480 = auVar109;
  auVar109 = vshufps_avx(auVar85,auVar85,0xaa);
  register0x00001290 = auVar109;
  _local_4a0 = auVar109;
  auVar109 = vshufps_avx(auVar85,auVar85,0xff);
  register0x00001290 = auVar109;
  _local_4c0 = auVar109;
  auVar109 = vshufps_avx(auVar9,auVar9,0);
  register0x00001290 = auVar109;
  _local_4e0 = auVar109;
  auVar109 = vshufps_avx(auVar9,auVar9,0x55);
  register0x00001290 = auVar109;
  _local_500 = auVar109;
  auVar109 = vshufps_avx(auVar9,auVar9,0xaa);
  register0x00001290 = auVar109;
  _local_520 = auVar109;
  auVar109 = vshufps_avx(auVar9,auVar9,0xff);
  register0x00001290 = auVar109;
  _local_540 = auVar109;
  auVar109 = ZEXT416((uint)(fVar189 * fVar189 + fVar150 * fVar150 + fVar206 * fVar206));
  auVar109 = vshufps_avx(auVar109,auVar109,0);
  local_2a0._16_16_ = auVar109;
  local_2a0._0_16_ = auVar109;
  fVar189 = *(float *)(ray + k * 4 + 0x30);
  local_8f0 = ZEXT416((uint)fVar168);
  auVar109 = vshufps_avx(ZEXT416((uint)(fVar189 - fVar168)),ZEXT416((uint)(fVar189 - fVar168)),0);
  local_320._16_16_ = auVar109;
  local_320._0_16_ = auVar109;
  local_7d0 = vpshufd_avx(ZEXT416(uVar74),0);
  local_7e0 = vpshufd_avx(ZEXT416(*(uint *)(local_8c8 + lVar76 * 4 + 6)),0);
  register0x00001210 = auVar84;
  _local_880 = auVar84;
  uVar79 = 0;
  local_c48 = 1;
  auVar97._8_4_ = 0x7fffffff;
  auVar97._0_8_ = 0x7fffffff7fffffff;
  auVar97._12_4_ = 0x7fffffff;
  auVar97._16_4_ = 0x7fffffff;
  auVar97._20_4_ = 0x7fffffff;
  auVar97._24_4_ = 0x7fffffff;
  auVar97._28_4_ = 0x7fffffff;
  local_5c0 = vandps_avx(local_2a0,auVar97);
  auVar109 = vsqrtss_avx(local_a00,local_a00);
  auVar8 = vsqrtss_avx(local_a00,local_a00);
  local_630 = ZEXT816(0x3f80000000000000);
  do {
    auVar183._8_4_ = 0x3f800000;
    auVar183._0_8_ = 0x3f8000003f800000;
    auVar183._12_4_ = 0x3f800000;
    auVar183._16_4_ = 0x3f800000;
    auVar183._20_4_ = 0x3f800000;
    auVar183._24_4_ = 0x3f800000;
    auVar183._28_4_ = 0x3f800000;
    auVar155 = vmovshdup_avx(local_630);
    auVar83 = vsubps_avx(auVar155,local_630);
    auVar155 = vshufps_avx(local_630,local_630,0);
    auVar84 = vshufps_avx(auVar83,auVar83,0);
    auVar123._16_16_ = auVar84;
    auVar123._0_16_ = auVar84;
    fVar206 = auVar84._0_4_;
    fVar170 = auVar84._4_4_;
    fVar107 = auVar84._8_4_;
    fVar171 = auVar84._12_4_;
    fVar370 = auVar155._0_4_;
    auVar163._0_4_ = fVar370 + fVar206 * 0.0;
    fVar371 = auVar155._4_4_;
    auVar163._4_4_ = fVar371 + fVar170 * 0.14285715;
    fVar372 = auVar155._8_4_;
    auVar163._8_4_ = fVar372 + fVar107 * 0.2857143;
    fVar149 = auVar155._12_4_;
    auVar163._12_4_ = fVar149 + fVar171 * 0.42857146;
    auVar163._16_4_ = fVar370 + fVar206 * 0.5714286;
    auVar163._20_4_ = fVar371 + fVar170 * 0.71428573;
    auVar163._24_4_ = fVar372 + fVar107 * 0.8571429;
    auVar163._28_4_ = fVar149 + fVar171;
    auVar122 = vsubps_avx(auVar183,auVar163);
    fVar150 = auVar122._0_4_;
    fVar168 = auVar122._4_4_;
    fVar208 = auVar122._8_4_;
    fVar169 = auVar122._12_4_;
    fVar210 = auVar122._16_4_;
    fVar216 = auVar122._20_4_;
    fVar225 = auVar122._24_4_;
    fVar233 = fVar150 * fVar150 * fVar150;
    fVar226 = fVar168 * fVar168 * fVar168;
    fVar230 = fVar208 * fVar208 * fVar208;
    fVar234 = fVar169 * fVar169 * fVar169;
    fVar237 = fVar210 * fVar210 * fVar210;
    fVar241 = fVar216 * fVar216 * fVar216;
    fVar245 = fVar225 * fVar225 * fVar225;
    fVar249 = auVar163._0_4_ * auVar163._0_4_ * auVar163._0_4_;
    fVar257 = auVar163._4_4_ * auVar163._4_4_ * auVar163._4_4_;
    fVar258 = auVar163._8_4_ * auVar163._8_4_ * auVar163._8_4_;
    fVar259 = auVar163._12_4_ * auVar163._12_4_ * auVar163._12_4_;
    fVar260 = auVar163._16_4_ * auVar163._16_4_ * auVar163._16_4_;
    fVar261 = auVar163._20_4_ * auVar163._20_4_ * auVar163._20_4_;
    fVar262 = auVar163._24_4_ * auVar163._24_4_ * auVar163._24_4_;
    fVar229 = auVar163._0_4_ * fVar150;
    fVar207 = auVar163._4_4_ * fVar168;
    fVar209 = auVar163._8_4_ * fVar208;
    fVar211 = auVar163._12_4_ * fVar169;
    fVar212 = auVar163._16_4_ * fVar210;
    fVar213 = auVar163._20_4_ * fVar216;
    fVar214 = auVar163._24_4_ * fVar225;
    fVar321 = auVar314._28_4_ + auVar341._28_4_;
    fVar303 = auVar256._28_4_ + auVar205._28_4_ + fVar321;
    fVar311 = fVar321 + auVar224._28_4_ + auVar326._28_4_ + 1.0;
    fVar321 = fVar233 * 0.16666667;
    fVar227 = fVar226 * 0.16666667;
    fVar231 = fVar230 * 0.16666667;
    fVar235 = fVar234 * 0.16666667;
    fVar238 = fVar237 * 0.16666667;
    fVar242 = fVar241 * 0.16666667;
    fVar246 = fVar245 * 0.16666667;
    fVar263 = (fVar249 + fVar233 * 4.0 + fVar150 * fVar229 * 12.0 + auVar163._0_4_ * fVar229 * 6.0)
              * 0.16666667;
    fVar273 = (fVar257 + fVar226 * 4.0 + fVar168 * fVar207 * 12.0 + auVar163._4_4_ * fVar207 * 6.0)
              * 0.16666667;
    fVar278 = (fVar258 + fVar230 * 4.0 + fVar208 * fVar209 * 12.0 + auVar163._8_4_ * fVar209 * 6.0)
              * 0.16666667;
    fVar283 = (fVar259 + fVar234 * 4.0 + fVar169 * fVar211 * 12.0 + auVar163._12_4_ * fVar211 * 6.0)
              * 0.16666667;
    fVar288 = (fVar260 + fVar237 * 4.0 + fVar210 * fVar212 * 12.0 + auVar163._16_4_ * fVar212 * 6.0)
              * 0.16666667;
    fVar293 = (fVar261 + fVar241 * 4.0 + fVar216 * fVar213 * 12.0 + auVar163._20_4_ * fVar213 * 6.0)
              * 0.16666667;
    fVar298 = (fVar262 + fVar245 * 4.0 + fVar225 * fVar214 * 12.0 + auVar163._24_4_ * fVar214 * 6.0)
              * 0.16666667;
    fVar233 = (fVar249 * 4.0 + fVar233 + auVar163._0_4_ * fVar229 * 12.0 + fVar150 * fVar229 * 6.0)
              * 0.16666667;
    fVar226 = (fVar257 * 4.0 + fVar226 + auVar163._4_4_ * fVar207 * 12.0 + fVar168 * fVar207 * 6.0)
              * 0.16666667;
    fVar230 = (fVar258 * 4.0 + fVar230 + auVar163._8_4_ * fVar209 * 12.0 + fVar208 * fVar209 * 6.0)
              * 0.16666667;
    fVar234 = (fVar259 * 4.0 + fVar234 + auVar163._12_4_ * fVar211 * 12.0 + fVar169 * fVar211 * 6.0)
              * 0.16666667;
    fVar237 = (fVar260 * 4.0 + fVar237 + auVar163._16_4_ * fVar212 * 12.0 + fVar210 * fVar212 * 6.0)
              * 0.16666667;
    fVar241 = (fVar261 * 4.0 + fVar241 + auVar163._20_4_ * fVar213 * 12.0 + fVar216 * fVar213 * 6.0)
              * 0.16666667;
    fVar245 = (fVar262 * 4.0 + fVar245 + auVar163._24_4_ * fVar214 * 12.0 + fVar225 * fVar214 * 6.0)
              * 0.16666667;
    fVar249 = fVar249 * 0.16666667;
    fVar257 = fVar257 * 0.16666667;
    fVar258 = fVar258 * 0.16666667;
    fVar259 = fVar259 * 0.16666667;
    fVar260 = fVar260 * 0.16666667;
    fVar261 = fVar261 * 0.16666667;
    fVar262 = fVar262 * 0.16666667;
    fVar333 = auVar326._28_4_ + 12.0;
    fVar312 = fVar311 + 12.166667;
    fVar239 = auVar7._0_4_;
    fVar243 = auVar7._4_4_;
    fVar247 = auVar7._8_4_;
    fVar369 = auVar7._12_4_;
    fVar264 = fVar239 * fVar321 +
              fVar263 * (float)local_240._0_4_ +
              fVar249 * (float)local_4e0._0_4_ + fVar233 * (float)local_460._0_4_;
    fVar274 = fVar243 * fVar227 +
              fVar273 * (float)local_240._4_4_ +
              fVar257 * (float)local_4e0._4_4_ + fVar226 * (float)local_460._4_4_;
    fVar279 = fVar247 * fVar231 + fVar278 * fStack_238 + fVar258 * fStack_4d8 + fVar230 * fStack_458
    ;
    fVar284 = fVar369 * fVar235 + fVar283 * fStack_234 + fVar259 * fStack_4d4 + fVar234 * fStack_454
    ;
    fVar289 = fVar239 * fVar238 + fVar288 * fStack_230 + fVar260 * fStack_4d0 + fVar237 * fStack_450
    ;
    fVar294 = fVar243 * fVar242 + fVar293 * fStack_22c + fVar261 * fStack_4cc + fVar241 * fStack_44c
    ;
    fVar299 = fVar247 * fVar246 + fVar298 * fStack_228 + fVar262 * fStack_4c8 + fVar245 * fStack_448
    ;
    fVar304 = fVar303 + fVar312;
    fVar265 = (float)local_1e0._0_4_ * fVar321 +
              (float)local_260._0_4_ * fVar263 +
              fVar249 * (float)local_500._0_4_ + fVar233 * (float)local_480._0_4_;
    fVar275 = (float)local_1e0._4_4_ * fVar227 +
              (float)local_260._4_4_ * fVar273 +
              fVar257 * (float)local_500._4_4_ + fVar226 * (float)local_480._4_4_;
    fVar280 = fStack_1d8 * fVar231 +
              fStack_258 * fVar278 + fVar258 * fStack_4f8 + fVar230 * fStack_478;
    fVar285 = fStack_1d4 * fVar235 +
              fStack_254 * fVar283 + fVar259 * fStack_4f4 + fVar234 * fStack_474;
    fVar290 = fStack_1d0 * fVar238 +
              fStack_250 * fVar288 + fVar260 * fStack_4f0 + fVar237 * fStack_470;
    fVar295 = fStack_1cc * fVar242 +
              fStack_24c * fVar293 + fVar261 * fStack_4ec + fVar241 * fStack_46c;
    fVar300 = fStack_1c8 * fVar246 +
              fStack_248 * fVar298 + fVar262 * fStack_4e8 + fVar245 * fStack_468;
    fVar305 = fVar304 + fVar333 + 12.166667;
    local_940 = (float)local_200._0_4_ * fVar321 +
                (float)local_280._0_4_ * fVar263 +
                fVar249 * (float)local_520._0_4_ + fVar233 * (float)local_4a0._0_4_;
    fStack_93c = (float)local_200._4_4_ * fVar227 +
                 (float)local_280._4_4_ * fVar273 +
                 fVar257 * (float)local_520._4_4_ + fVar226 * (float)local_4a0._4_4_;
    fStack_938 = fStack_1f8 * fVar231 +
                 fStack_278 * fVar278 + fVar258 * fStack_518 + fVar230 * fStack_498;
    fStack_934 = fStack_1f4 * fVar235 +
                 fStack_274 * fVar283 + fVar259 * fStack_514 + fVar234 * fStack_494;
    fStack_930 = fStack_1f0 * fVar238 +
                 fStack_270 * fVar288 + fVar260 * fStack_510 + fVar237 * fStack_490;
    fStack_92c = fStack_1ec * fVar242 +
                 fStack_26c * fVar293 + fVar261 * fStack_50c + fVar241 * fStack_48c;
    fStack_928 = fStack_1e8 * fVar246 +
                 fStack_268 * fVar298 + fVar262 * fStack_508 + fVar245 * fStack_488;
    fStack_924 = fVar305 + fVar333 + auVar341._28_4_ + 12.0;
    local_a80._0_4_ =
         (float)local_220._0_4_ * fVar321 +
         fVar263 * (float)local_440._0_4_ +
         fVar233 * (float)local_4c0._0_4_ + fVar249 * (float)local_540._0_4_;
    local_a80._4_4_ =
         (float)local_220._4_4_ * fVar227 +
         fVar273 * (float)local_440._4_4_ +
         fVar226 * (float)local_4c0._4_4_ + fVar257 * (float)local_540._4_4_;
    fStack_a78 = fStack_218 * fVar231 +
                 fVar278 * fStack_438 + fVar230 * fStack_4b8 + fVar258 * fStack_538;
    fStack_a74 = fStack_214 * fVar235 +
                 fVar283 * fStack_434 + fVar234 * fStack_4b4 + fVar259 * fStack_534;
    fStack_a70 = fStack_210 * fVar238 +
                 fVar288 * fStack_430 + fVar237 * fStack_4b0 + fVar260 * fStack_530;
    fStack_a6c = fStack_20c * fVar242 +
                 fVar293 * fStack_42c + fVar241 * fStack_4ac + fVar261 * fStack_52c;
    fStack_a68 = fStack_208 * fVar246 +
                 fVar298 * fStack_428 + fVar245 * fStack_4a8 + fVar262 * fStack_528;
    fStack_a64 = auVar224._28_4_ + fVar303 + fVar311 + auVar256._28_4_;
    auVar17._4_4_ = auVar163._4_4_ * -auVar163._4_4_;
    auVar17._0_4_ = auVar163._0_4_ * -auVar163._0_4_;
    auVar17._8_4_ = auVar163._8_4_ * -auVar163._8_4_;
    auVar17._12_4_ = auVar163._12_4_ * -auVar163._12_4_;
    auVar17._16_4_ = auVar163._16_4_ * -auVar163._16_4_;
    auVar17._20_4_ = auVar163._20_4_ * -auVar163._20_4_;
    auVar17._24_4_ = auVar163._24_4_ * -auVar163._24_4_;
    auVar17._28_4_ = auVar163._28_4_;
    auVar11._4_4_ = fVar207 * 4.0;
    auVar11._0_4_ = fVar229 * 4.0;
    auVar11._8_4_ = fVar209 * 4.0;
    auVar11._12_4_ = fVar211 * 4.0;
    auVar11._16_4_ = fVar212 * 4.0;
    auVar11._20_4_ = fVar213 * 4.0;
    auVar11._24_4_ = fVar214 * 4.0;
    auVar11._28_4_ = auVar205._28_4_;
    auVar122 = vsubps_avx(auVar17,auVar11);
    fVar241 = fVar150 * -fVar150 * 0.5;
    fVar242 = fVar168 * -fVar168 * 0.5;
    fVar245 = fVar208 * -fVar208 * 0.5;
    fVar246 = fVar169 * -fVar169 * 0.5;
    fVar258 = fVar210 * -fVar210 * 0.5;
    fVar259 = fVar216 * -fVar216 * 0.5;
    fVar260 = fVar225 * -fVar225 * 0.5;
    fVar226 = auVar122._0_4_ * 0.5;
    fVar227 = auVar122._4_4_ * 0.5;
    fVar230 = auVar122._8_4_ * 0.5;
    fVar231 = auVar122._12_4_ * 0.5;
    fVar235 = auVar122._16_4_ * 0.5;
    fVar237 = auVar122._20_4_ * 0.5;
    fVar238 = auVar122._24_4_ * 0.5;
    fVar233 = (fVar150 * fVar150 + fVar229 * 4.0) * 0.5;
    fVar207 = (fVar168 * fVar168 + fVar207 * 4.0) * 0.5;
    fVar209 = (fVar208 * fVar208 + fVar209 * 4.0) * 0.5;
    fVar211 = (fVar169 * fVar169 + fVar211 * 4.0) * 0.5;
    fVar321 = (fVar210 * fVar210 + fVar212 * 4.0) * 0.5;
    fVar213 = (fVar216 * fVar216 + fVar213 * 4.0) * 0.5;
    fVar214 = (fVar225 * fVar225 + fVar214 * 4.0) * 0.5;
    fVar150 = auVar163._0_4_ * auVar163._0_4_ * 0.5;
    fVar168 = auVar163._4_4_ * auVar163._4_4_ * 0.5;
    fVar208 = auVar163._8_4_ * auVar163._8_4_ * 0.5;
    fVar169 = auVar163._12_4_ * auVar163._12_4_ * 0.5;
    fVar216 = auVar163._16_4_ * auVar163._16_4_ * 0.5;
    fVar225 = auVar163._20_4_ * auVar163._20_4_ * 0.5;
    fVar229 = auVar163._24_4_ * auVar163._24_4_ * 0.5;
    auVar155 = vpermilps_avx(ZEXT416((uint)(auVar83._0_4_ * 0.04761905)),0);
    fVar210 = auVar155._0_4_;
    fVar266 = fVar210 * (fVar239 * fVar241 +
                        (float)local_240._0_4_ * fVar226 +
                        fVar233 * (float)local_460._0_4_ + fVar150 * (float)local_4e0._0_4_);
    fVar212 = auVar155._4_4_;
    fVar276 = fVar212 * (fVar243 * fVar242 +
                        (float)local_240._4_4_ * fVar227 +
                        fVar207 * (float)local_460._4_4_ + fVar168 * (float)local_4e0._4_4_);
    auVar16._4_4_ = fVar276;
    auVar16._0_4_ = fVar266;
    fVar234 = auVar155._8_4_;
    fVar281 = fVar234 * (fVar247 * fVar245 +
                        fStack_238 * fVar230 + fVar209 * fStack_458 + fVar208 * fStack_4d8);
    auVar16._8_4_ = fVar281;
    fVar249 = auVar155._12_4_;
    fVar286 = fVar249 * (fVar369 * fVar246 +
                        fStack_234 * fVar231 + fVar211 * fStack_454 + fVar169 * fStack_4d4);
    auVar16._12_4_ = fVar286;
    fVar291 = fVar210 * (fVar239 * fVar258 +
                        fStack_230 * fVar235 + fVar321 * fStack_450 + fVar216 * fStack_4d0);
    auVar16._16_4_ = fVar291;
    fVar296 = fVar212 * (fVar243 * fVar259 +
                        fStack_22c * fVar237 + fVar213 * fStack_44c + fVar225 * fStack_4cc);
    auVar16._20_4_ = fVar296;
    fVar301 = fVar234 * (fVar247 * fVar260 +
                        fStack_228 * fVar238 + fVar214 * fStack_448 + fVar229 * fStack_4c8);
    auVar16._24_4_ = fVar301;
    auVar16._28_4_ = fStack_924 + fVar312;
    fVar322 = fVar210 * ((float)local_1e0._0_4_ * fVar241 +
                        (float)local_260._0_4_ * fVar226 +
                        fVar233 * (float)local_480._0_4_ + fVar150 * (float)local_500._0_4_);
    fVar327 = fVar212 * ((float)local_1e0._4_4_ * fVar242 +
                        (float)local_260._4_4_ * fVar227 +
                        fVar207 * (float)local_480._4_4_ + fVar168 * (float)local_500._4_4_);
    auVar18._4_4_ = fVar327;
    auVar18._0_4_ = fVar322;
    fVar328 = fVar234 * (fStack_1d8 * fVar245 +
                        fStack_258 * fVar230 + fVar209 * fStack_478 + fVar208 * fStack_4f8);
    auVar18._8_4_ = fVar328;
    fVar329 = fVar249 * (fStack_1d4 * fVar246 +
                        fStack_254 * fVar231 + fVar211 * fStack_474 + fVar169 * fStack_4f4);
    auVar18._12_4_ = fVar329;
    fVar330 = fVar210 * (fStack_1d0 * fVar258 +
                        fStack_250 * fVar235 + fVar321 * fStack_470 + fVar216 * fStack_4f0);
    auVar18._16_4_ = fVar330;
    fVar331 = fVar212 * (fStack_1cc * fVar259 +
                        fStack_24c * fVar237 + fVar213 * fStack_46c + fVar225 * fStack_4ec);
    auVar18._20_4_ = fVar331;
    fVar332 = fVar234 * (fStack_1c8 * fVar260 +
                        fStack_248 * fVar238 + fVar214 * fStack_468 + fVar229 * fStack_4e8);
    auVar18._24_4_ = fVar332;
    auVar18._28_4_ = fStack_204;
    fVar334 = fVar210 * ((float)local_200._0_4_ * fVar241 +
                        fVar150 * (float)local_520._0_4_ + fVar233 * (float)local_4a0._0_4_ +
                        (float)local_280._0_4_ * fVar226);
    fVar342 = fVar212 * ((float)local_200._4_4_ * fVar242 +
                        fVar168 * (float)local_520._4_4_ + fVar207 * (float)local_4a0._4_4_ +
                        (float)local_280._4_4_ * fVar227);
    auVar19._4_4_ = fVar342;
    auVar19._0_4_ = fVar334;
    fVar344 = fVar234 * (fStack_1f8 * fVar245 +
                        fVar208 * fStack_518 + fVar209 * fStack_498 + fStack_278 * fVar230);
    auVar19._8_4_ = fVar344;
    fVar346 = fVar249 * (fStack_1f4 * fVar246 +
                        fVar169 * fStack_514 + fVar211 * fStack_494 + fStack_274 * fVar231);
    auVar19._12_4_ = fVar346;
    fVar348 = fVar210 * (fStack_1f0 * fVar258 +
                        fVar216 * fStack_510 + fVar321 * fStack_490 + fStack_270 * fVar235);
    auVar19._16_4_ = fVar348;
    fVar350 = fVar212 * (fStack_1ec * fVar259 +
                        fVar225 * fStack_50c + fVar213 * fStack_48c + fStack_26c * fVar237);
    auVar19._20_4_ = fVar350;
    fVar352 = fVar234 * (fStack_1e8 * fVar260 +
                        fVar229 * fStack_508 + fVar214 * fStack_488 + fStack_268 * fVar238);
    auVar19._24_4_ = fVar352;
    auVar19._28_4_ = fStack_1c4;
    fVar233 = fVar210 * ((float)local_220._0_4_ * fVar241 +
                        fVar226 * (float)local_440._0_4_ +
                        fVar150 * (float)local_540._0_4_ + fVar233 * (float)local_4c0._0_4_);
    fVar226 = fVar212 * ((float)local_220._4_4_ * fVar242 +
                        fVar227 * (float)local_440._4_4_ +
                        fVar168 * (float)local_540._4_4_ + fVar207 * (float)local_4c0._4_4_);
    auVar12._4_4_ = fVar226;
    auVar12._0_4_ = fVar233;
    fVar241 = fVar234 * (fStack_218 * fVar245 +
                        fVar230 * fStack_438 + fVar208 * fStack_538 + fVar209 * fStack_4b8);
    auVar12._8_4_ = fVar241;
    fVar257 = fVar249 * (fStack_214 * fVar246 +
                        fVar231 * fStack_434 + fVar169 * fStack_534 + fVar211 * fStack_4b4);
    auVar12._12_4_ = fVar257;
    fVar210 = fVar210 * (fStack_210 * fVar258 +
                        fVar235 * fStack_430 + fVar216 * fStack_530 + fVar321 * fStack_4b0);
    auVar12._16_4_ = fVar210;
    fVar212 = fVar212 * (fStack_20c * fVar259 +
                        fVar237 * fStack_42c + fVar225 * fStack_52c + fVar213 * fStack_4ac);
    auVar12._20_4_ = fVar212;
    fVar234 = fVar234 * (fStack_208 * fVar260 +
                        fVar238 * fStack_428 + fVar229 * fStack_528 + fVar214 * fStack_4a8);
    auVar12._24_4_ = fVar234;
    auVar12._28_4_ = fVar249;
    auVar65._4_4_ = fVar275;
    auVar65._0_4_ = fVar265;
    auVar65._8_4_ = fVar280;
    auVar65._12_4_ = fVar285;
    auVar65._16_4_ = fVar290;
    auVar65._20_4_ = fVar295;
    auVar65._24_4_ = fVar300;
    auVar65._28_4_ = fVar305;
    auVar122 = vperm2f128_avx(auVar65,auVar65,1);
    auVar122 = vshufps_avx(auVar122,auVar65,0x30);
    auVar11 = vshufps_avx(auVar65,auVar122,0x29);
    auVar71._4_4_ = fStack_93c;
    auVar71._0_4_ = local_940;
    auVar71._8_4_ = fStack_938;
    auVar71._12_4_ = fStack_934;
    auVar71._16_4_ = fStack_930;
    auVar71._20_4_ = fStack_92c;
    auVar71._24_4_ = fStack_928;
    auVar71._28_4_ = fStack_924;
    auVar122 = vperm2f128_avx(auVar71,auVar71,1);
    auVar122 = vshufps_avx(auVar122,auVar71,0x30);
    local_a40 = vshufps_avx(auVar71,auVar122,0x29);
    auVar97 = vsubps_avx(_local_a80,auVar12);
    auVar122 = vperm2f128_avx(auVar97,auVar97,1);
    auVar122 = vshufps_avx(auVar122,auVar97,0x30);
    local_660 = vshufps_avx(auVar97,auVar122,0x29);
    local_580 = vsubps_avx(auVar11,auVar65);
    local_2e0 = vsubps_avx(local_a40,auVar71);
    fVar168 = local_580._0_4_;
    fVar216 = local_580._4_4_;
    auVar13._4_4_ = fVar342 * fVar216;
    auVar13._0_4_ = fVar334 * fVar168;
    fVar207 = local_580._8_4_;
    auVar13._8_4_ = fVar344 * fVar207;
    fVar321 = local_580._12_4_;
    auVar13._12_4_ = fVar346 * fVar321;
    fVar227 = local_580._16_4_;
    auVar13._16_4_ = fVar348 * fVar227;
    fVar235 = local_580._20_4_;
    auVar13._20_4_ = fVar350 * fVar235;
    fVar242 = local_580._24_4_;
    auVar13._24_4_ = fVar352 * fVar242;
    auVar13._28_4_ = auVar97._28_4_;
    fVar208 = local_2e0._0_4_;
    fVar225 = local_2e0._4_4_;
    auVar14._4_4_ = fVar327 * fVar225;
    auVar14._0_4_ = fVar322 * fVar208;
    fVar209 = local_2e0._8_4_;
    auVar14._8_4_ = fVar328 * fVar209;
    fVar213 = local_2e0._12_4_;
    auVar14._12_4_ = fVar329 * fVar213;
    fVar230 = local_2e0._16_4_;
    auVar14._16_4_ = fVar330 * fVar230;
    fVar237 = local_2e0._20_4_;
    auVar14._20_4_ = fVar331 * fVar237;
    fVar245 = local_2e0._24_4_;
    auVar14._24_4_ = fVar332 * fVar245;
    auVar14._28_4_ = auVar122._28_4_;
    auVar13 = vsubps_avx(auVar14,auVar13);
    auVar67._4_4_ = fVar274;
    auVar67._0_4_ = fVar264;
    auVar67._8_4_ = fVar279;
    auVar67._12_4_ = fVar284;
    auVar67._16_4_ = fVar289;
    auVar67._20_4_ = fVar294;
    auVar67._24_4_ = fVar299;
    auVar67._28_4_ = fVar304;
    auVar122 = vperm2f128_avx(auVar67,auVar67,1);
    auVar122 = vshufps_avx(auVar122,auVar67,0x30);
    auVar12 = vshufps_avx(auVar67,auVar122,0x29);
    local_5a0 = vsubps_avx(auVar12,auVar67);
    auVar100._4_4_ = fVar276 * fVar225;
    auVar100._0_4_ = fVar266 * fVar208;
    auVar100._8_4_ = fVar281 * fVar209;
    auVar100._12_4_ = fVar286 * fVar213;
    auVar100._16_4_ = fVar291 * fVar230;
    auVar100._20_4_ = fVar296 * fVar237;
    auVar100._24_4_ = fVar301 * fVar245;
    auVar100._28_4_ = auVar12._28_4_;
    fVar169 = local_5a0._0_4_;
    fVar229 = local_5a0._4_4_;
    auVar15._4_4_ = fVar342 * fVar229;
    auVar15._0_4_ = fVar334 * fVar169;
    fVar211 = local_5a0._8_4_;
    auVar15._8_4_ = fVar344 * fVar211;
    fVar214 = local_5a0._12_4_;
    auVar15._12_4_ = fVar346 * fVar214;
    fVar231 = local_5a0._16_4_;
    auVar15._16_4_ = fVar348 * fVar231;
    fVar238 = local_5a0._20_4_;
    auVar15._20_4_ = fVar350 * fVar238;
    fVar246 = local_5a0._24_4_;
    auVar15._24_4_ = fVar352 * fVar246;
    auVar15._28_4_ = fVar312;
    auVar14 = vsubps_avx(auVar15,auVar100);
    auVar20._4_4_ = fVar327 * fVar229;
    auVar20._0_4_ = fVar322 * fVar169;
    auVar20._8_4_ = fVar328 * fVar211;
    auVar20._12_4_ = fVar329 * fVar214;
    auVar20._16_4_ = fVar330 * fVar231;
    auVar20._20_4_ = fVar331 * fVar238;
    auVar20._24_4_ = fVar332 * fVar246;
    auVar20._28_4_ = fVar312;
    auVar21._4_4_ = fVar276 * fVar216;
    auVar21._0_4_ = fVar266 * fVar168;
    auVar21._8_4_ = fVar281 * fVar207;
    auVar21._12_4_ = fVar286 * fVar321;
    auVar21._16_4_ = fVar291 * fVar227;
    auVar21._20_4_ = fVar296 * fVar235;
    auVar21._24_4_ = fVar301 * fVar242;
    auVar21._28_4_ = uStack_1e4;
    auVar100 = vsubps_avx(auVar21,auVar20);
    fVar150 = auVar100._28_4_;
    auVar143._0_4_ = fVar169 * fVar169 + fVar168 * fVar168 + fVar208 * fVar208;
    auVar143._4_4_ = fVar229 * fVar229 + fVar216 * fVar216 + fVar225 * fVar225;
    auVar143._8_4_ = fVar211 * fVar211 + fVar207 * fVar207 + fVar209 * fVar209;
    auVar143._12_4_ = fVar214 * fVar214 + fVar321 * fVar321 + fVar213 * fVar213;
    auVar143._16_4_ = fVar231 * fVar231 + fVar227 * fVar227 + fVar230 * fVar230;
    auVar143._20_4_ = fVar238 * fVar238 + fVar235 * fVar235 + fVar237 * fVar237;
    auVar143._24_4_ = fVar246 * fVar246 + fVar242 * fVar242 + fVar245 * fVar245;
    auVar143._28_4_ = fVar150 + fVar150 + auVar13._28_4_;
    auVar122 = vrcpps_avx(auVar143);
    fVar258 = auVar122._0_4_;
    fVar259 = auVar122._4_4_;
    auVar22._4_4_ = fVar259 * auVar143._4_4_;
    auVar22._0_4_ = fVar258 * auVar143._0_4_;
    fVar260 = auVar122._8_4_;
    auVar22._8_4_ = fVar260 * auVar143._8_4_;
    fVar261 = auVar122._12_4_;
    auVar22._12_4_ = fVar261 * auVar143._12_4_;
    fVar262 = auVar122._16_4_;
    auVar22._16_4_ = fVar262 * auVar143._16_4_;
    fVar263 = auVar122._20_4_;
    auVar22._20_4_ = fVar263 * auVar143._20_4_;
    fVar273 = auVar122._24_4_;
    auVar22._24_4_ = fVar273 * auVar143._24_4_;
    auVar22._28_4_ = uStack_1e4;
    auVar221._8_4_ = 0x3f800000;
    auVar221._0_8_ = 0x3f8000003f800000;
    auVar221._12_4_ = 0x3f800000;
    auVar221._16_4_ = 0x3f800000;
    auVar221._20_4_ = 0x3f800000;
    auVar221._24_4_ = 0x3f800000;
    auVar221._28_4_ = 0x3f800000;
    auVar15 = vsubps_avx(auVar221,auVar22);
    fVar258 = fVar258 + fVar258 * auVar15._0_4_;
    fVar259 = fVar259 + fVar259 * auVar15._4_4_;
    fVar260 = fVar260 + fVar260 * auVar15._8_4_;
    fVar261 = fVar261 + fVar261 * auVar15._12_4_;
    fVar262 = fVar262 + fVar262 * auVar15._16_4_;
    fVar263 = fVar263 + fVar263 * auVar15._20_4_;
    fVar273 = fVar273 + fVar273 * auVar15._24_4_;
    auVar97 = vperm2f128_avx(auVar18,auVar18,1);
    auVar97 = vshufps_avx(auVar97,auVar18,0x30);
    auVar97 = vshufps_avx(auVar18,auVar97,0x29);
    auVar17 = vperm2f128_avx(auVar19,auVar19,1);
    auVar17 = vshufps_avx(auVar17,auVar19,0x30);
    local_800 = vshufps_avx(auVar19,auVar17,0x29);
    fVar335 = local_800._0_4_;
    fVar343 = local_800._4_4_;
    auVar23._4_4_ = fVar343 * fVar216;
    auVar23._0_4_ = fVar335 * fVar168;
    fVar345 = local_800._8_4_;
    auVar23._8_4_ = fVar345 * fVar207;
    fVar347 = local_800._12_4_;
    auVar23._12_4_ = fVar347 * fVar321;
    fVar349 = local_800._16_4_;
    auVar23._16_4_ = fVar349 * fVar227;
    fVar351 = local_800._20_4_;
    auVar23._20_4_ = fVar351 * fVar235;
    fVar353 = local_800._24_4_;
    auVar23._24_4_ = fVar353 * fVar242;
    auVar23._28_4_ = auVar17._28_4_;
    fVar303 = auVar97._0_4_;
    fVar311 = auVar97._4_4_;
    auVar24._4_4_ = fVar311 * fVar225;
    auVar24._0_4_ = fVar303 * fVar208;
    fVar312 = auVar97._8_4_;
    auVar24._8_4_ = fVar312 * fVar209;
    fVar333 = auVar97._12_4_;
    auVar24._12_4_ = fVar333 * fVar213;
    fVar239 = auVar97._16_4_;
    auVar24._16_4_ = fVar239 * fVar230;
    fVar243 = auVar97._20_4_;
    auVar24._20_4_ = fVar243 * fVar237;
    fVar247 = auVar97._24_4_;
    auVar24._24_4_ = fVar247 * fVar245;
    auVar24._28_4_ = fStack_204;
    auVar17 = vsubps_avx(auVar24,auVar23);
    auVar97 = vperm2f128_avx(auVar16,auVar16,1);
    auVar97 = vshufps_avx(auVar97,auVar16,0x30);
    local_a20 = vshufps_avx(auVar16,auVar97,0x29);
    fVar267 = local_a20._0_4_;
    fVar277 = local_a20._4_4_;
    auVar25._4_4_ = fVar277 * fVar225;
    auVar25._0_4_ = fVar267 * fVar208;
    fVar282 = local_a20._8_4_;
    auVar25._8_4_ = fVar282 * fVar209;
    fVar287 = local_a20._12_4_;
    auVar25._12_4_ = fVar287 * fVar213;
    fVar292 = local_a20._16_4_;
    auVar25._16_4_ = fVar292 * fVar230;
    fVar297 = local_a20._20_4_;
    auVar25._20_4_ = fVar297 * fVar237;
    fVar302 = local_a20._24_4_;
    auVar25._24_4_ = fVar302 * fVar245;
    auVar25._28_4_ = auVar97._28_4_;
    auVar26._4_4_ = fVar343 * fVar229;
    auVar26._0_4_ = fVar335 * fVar169;
    auVar26._8_4_ = fVar345 * fVar211;
    auVar26._12_4_ = fVar347 * fVar214;
    auVar26._16_4_ = fVar349 * fVar231;
    auVar26._20_4_ = fVar351 * fVar238;
    uVar80 = local_800._28_4_;
    auVar26._24_4_ = fVar353 * fVar246;
    auVar26._28_4_ = uVar80;
    auVar97 = vsubps_avx(auVar26,auVar25);
    auVar27._4_4_ = fVar229 * fVar311;
    auVar27._0_4_ = fVar169 * fVar303;
    auVar27._8_4_ = fVar211 * fVar312;
    auVar27._12_4_ = fVar214 * fVar333;
    auVar27._16_4_ = fVar231 * fVar239;
    auVar27._20_4_ = fVar238 * fVar243;
    auVar27._24_4_ = fVar246 * fVar247;
    auVar27._28_4_ = uVar80;
    auVar28._4_4_ = fVar277 * fVar216;
    auVar28._0_4_ = fVar267 * fVar168;
    auVar28._8_4_ = fVar282 * fVar207;
    auVar28._12_4_ = fVar287 * fVar321;
    auVar28._16_4_ = fVar292 * fVar227;
    auVar28._20_4_ = fVar297 * fVar235;
    auVar28._24_4_ = fVar302 * fVar242;
    auVar28._28_4_ = fVar305;
    auVar16 = vsubps_avx(auVar28,auVar27);
    auVar29._4_4_ =
         fVar259 * (auVar13._4_4_ * auVar13._4_4_ +
                   auVar100._4_4_ * auVar100._4_4_ + auVar14._4_4_ * auVar14._4_4_);
    auVar29._0_4_ =
         fVar258 * (auVar13._0_4_ * auVar13._0_4_ +
                   auVar100._0_4_ * auVar100._0_4_ + auVar14._0_4_ * auVar14._0_4_);
    auVar29._8_4_ =
         fVar260 * (auVar13._8_4_ * auVar13._8_4_ +
                   auVar100._8_4_ * auVar100._8_4_ + auVar14._8_4_ * auVar14._8_4_);
    auVar29._12_4_ =
         fVar261 * (auVar13._12_4_ * auVar13._12_4_ +
                   auVar100._12_4_ * auVar100._12_4_ + auVar14._12_4_ * auVar14._12_4_);
    auVar29._16_4_ =
         fVar262 * (auVar13._16_4_ * auVar13._16_4_ +
                   auVar100._16_4_ * auVar100._16_4_ + auVar14._16_4_ * auVar14._16_4_);
    auVar29._20_4_ =
         fVar263 * (auVar13._20_4_ * auVar13._20_4_ +
                   auVar100._20_4_ * auVar100._20_4_ + auVar14._20_4_ * auVar14._20_4_);
    auVar29._24_4_ =
         fVar273 * (auVar13._24_4_ * auVar13._24_4_ +
                   auVar100._24_4_ * auVar100._24_4_ + auVar14._24_4_ * auVar14._24_4_);
    auVar29._28_4_ = auVar13._28_4_ + fVar150 + auVar14._28_4_;
    auVar30._4_4_ =
         (auVar17._4_4_ * auVar17._4_4_ +
         auVar97._4_4_ * auVar97._4_4_ + auVar16._4_4_ * auVar16._4_4_) * fVar259;
    auVar30._0_4_ =
         (auVar17._0_4_ * auVar17._0_4_ +
         auVar97._0_4_ * auVar97._0_4_ + auVar16._0_4_ * auVar16._0_4_) * fVar258;
    auVar30._8_4_ =
         (auVar17._8_4_ * auVar17._8_4_ +
         auVar97._8_4_ * auVar97._8_4_ + auVar16._8_4_ * auVar16._8_4_) * fVar260;
    auVar30._12_4_ =
         (auVar17._12_4_ * auVar17._12_4_ +
         auVar97._12_4_ * auVar97._12_4_ + auVar16._12_4_ * auVar16._12_4_) * fVar261;
    auVar30._16_4_ =
         (auVar17._16_4_ * auVar17._16_4_ +
         auVar97._16_4_ * auVar97._16_4_ + auVar16._16_4_ * auVar16._16_4_) * fVar262;
    auVar30._20_4_ =
         (auVar17._20_4_ * auVar17._20_4_ +
         auVar97._20_4_ * auVar97._20_4_ + auVar16._20_4_ * auVar16._20_4_) * fVar263;
    auVar30._24_4_ =
         (auVar17._24_4_ * auVar17._24_4_ +
         auVar97._24_4_ * auVar97._24_4_ + auVar16._24_4_ * auVar16._24_4_) * fVar273;
    auVar30._28_4_ = auVar122._28_4_ + auVar15._28_4_;
    auVar122 = vmaxps_avx(auVar29,auVar30);
    auVar97 = vperm2f128_avx(_local_a80,_local_a80,1);
    auVar97 = vshufps_avx(auVar97,_local_a80,0x30);
    local_680 = vshufps_avx(_local_a80,auVar97,0x29);
    auVar98._0_4_ = (float)local_a80._0_4_ + fVar233;
    auVar98._4_4_ = (float)local_a80._4_4_ + fVar226;
    auVar98._8_4_ = fStack_a78 + fVar241;
    auVar98._12_4_ = fStack_a74 + fVar257;
    auVar98._16_4_ = fStack_a70 + fVar210;
    auVar98._20_4_ = fStack_a6c + fVar212;
    auVar98._24_4_ = fStack_a68 + fVar234;
    auVar98._28_4_ = fStack_a64 + fVar249;
    auVar97 = vmaxps_avx(_local_a80,auVar98);
    auVar17 = vmaxps_avx(local_660,local_680);
    auVar97 = vmaxps_avx(auVar97,auVar17);
    auVar17 = vrsqrtps_avx(auVar143);
    fVar150 = auVar17._0_4_;
    fVar210 = auVar17._4_4_;
    fVar233 = auVar17._8_4_;
    fVar212 = auVar17._12_4_;
    fVar226 = auVar17._16_4_;
    fVar234 = auVar17._20_4_;
    fVar241 = auVar17._24_4_;
    auVar31._4_4_ = fVar210 * fVar210 * fVar210 * auVar143._4_4_ * 0.5;
    auVar31._0_4_ = fVar150 * fVar150 * fVar150 * auVar143._0_4_ * 0.5;
    auVar31._8_4_ = fVar233 * fVar233 * fVar233 * auVar143._8_4_ * 0.5;
    auVar31._12_4_ = fVar212 * fVar212 * fVar212 * auVar143._12_4_ * 0.5;
    auVar31._16_4_ = fVar226 * fVar226 * fVar226 * auVar143._16_4_ * 0.5;
    auVar31._20_4_ = fVar234 * fVar234 * fVar234 * auVar143._20_4_ * 0.5;
    auVar31._24_4_ = fVar241 * fVar241 * fVar241 * auVar143._24_4_ * 0.5;
    auVar31._28_4_ = auVar143._28_4_;
    auVar32._4_4_ = fVar210 * 1.5;
    auVar32._0_4_ = fVar150 * 1.5;
    auVar32._8_4_ = fVar233 * 1.5;
    auVar32._12_4_ = fVar212 * 1.5;
    auVar32._16_4_ = fVar226 * 1.5;
    auVar32._20_4_ = fVar234 * 1.5;
    auVar32._24_4_ = fVar241 * 1.5;
    auVar32._28_4_ = auVar17._28_4_;
    local_5e0 = vsubps_avx(auVar32,auVar31);
    auVar66._4_4_ = fVar275;
    auVar66._0_4_ = fVar265;
    auVar66._8_4_ = fVar280;
    auVar66._12_4_ = fVar285;
    auVar66._16_4_ = fVar290;
    auVar66._20_4_ = fVar295;
    auVar66._24_4_ = fVar300;
    auVar66._28_4_ = fVar305;
    local_820 = vsubps_avx(ZEXT832(0) << 0x20,auVar66);
    auVar13 = vsubps_avx(ZEXT832(0) << 0x20,auVar71);
    auVar314 = ZEXT3264(auVar13);
    fVar313 = auVar13._0_4_;
    fVar315 = auVar13._4_4_;
    fVar316 = auVar13._8_4_;
    fVar317 = auVar13._12_4_;
    fVar318 = auVar13._16_4_;
    fVar319 = auVar13._20_4_;
    fVar320 = auVar13._24_4_;
    fVar359 = local_820._0_4_;
    fVar363 = local_820._4_4_;
    fVar364 = local_820._8_4_;
    fVar365 = local_820._12_4_;
    fVar366 = local_820._16_4_;
    fVar367 = local_820._20_4_;
    fVar368 = local_820._24_4_;
    auVar68._4_4_ = fVar274;
    auVar68._0_4_ = fVar264;
    auVar68._8_4_ = fVar279;
    auVar68._12_4_ = fVar284;
    auVar68._16_4_ = fVar289;
    auVar68._20_4_ = fVar294;
    auVar68._24_4_ = fVar299;
    auVar68._28_4_ = fVar304;
    auVar100 = ZEXT832(0) << 0x20;
    auVar13 = vsubps_avx(auVar100,auVar68);
    fVar210 = auVar13._0_4_;
    fVar233 = auVar13._4_4_;
    fVar212 = auVar13._8_4_;
    fVar226 = auVar13._12_4_;
    fVar234 = auVar13._16_4_;
    fVar241 = auVar13._20_4_;
    fVar249 = auVar13._24_4_;
    auVar307._0_4_ =
         (float)local_8a0._0_4_ * fVar210 +
         fVar359 * (float)local_700._0_4_ + fVar313 * (float)local_720._0_4_;
    auVar307._4_4_ =
         (float)local_8a0._4_4_ * fVar233 +
         fVar363 * (float)local_700._4_4_ + fVar315 * (float)local_720._4_4_;
    auVar307._8_4_ = fStack_898 * fVar212 + fVar364 * fStack_6f8 + fVar316 * fStack_718;
    auVar307._12_4_ = fStack_894 * fVar226 + fVar365 * fStack_6f4 + fVar317 * fStack_714;
    auVar307._16_4_ = fStack_890 * fVar234 + fVar366 * fStack_6f0 + fVar318 * fStack_710;
    auVar307._20_4_ = fStack_88c * fVar241 + fVar367 * fStack_6ec + fVar319 * fStack_70c;
    auVar307._24_4_ = fStack_888 * fVar249 + fVar368 * fStack_6e8 + fVar320 * fStack_708;
    auVar307._28_4_ = auVar16._28_4_ + auVar17._28_4_ + auVar143._28_4_;
    auVar338._0_4_ = fVar210 * fVar210 + fVar359 * fVar359 + fVar313 * fVar313;
    auVar338._4_4_ = fVar233 * fVar233 + fVar363 * fVar363 + fVar315 * fVar315;
    auVar338._8_4_ = fVar212 * fVar212 + fVar364 * fVar364 + fVar316 * fVar316;
    auVar338._12_4_ = fVar226 * fVar226 + fVar365 * fVar365 + fVar317 * fVar317;
    auVar338._16_4_ = fVar234 * fVar234 + fVar366 * fVar366 + fVar318 * fVar318;
    auVar338._20_4_ = fVar241 * fVar241 + fVar367 * fVar367 + fVar319 * fVar319;
    auVar338._24_4_ = fVar249 * fVar249 + fVar368 * fVar368 + fVar320 * fVar320;
    auVar338._28_4_ = fVar305 + fVar305 + auVar16._28_4_;
    fVar263 = local_5e0._0_4_;
    fVar273 = local_5e0._4_4_;
    fVar278 = local_5e0._8_4_;
    fVar283 = local_5e0._12_4_;
    fVar288 = local_5e0._16_4_;
    fVar293 = local_5e0._20_4_;
    fVar298 = local_5e0._24_4_;
    local_600 = (float)local_8a0._0_4_ * fVar169 * fVar263 +
                fVar263 * fVar168 * (float)local_700._0_4_ +
                fVar263 * fVar208 * (float)local_720._0_4_;
    fStack_5fc = (float)local_8a0._4_4_ * fVar229 * fVar273 +
                 fVar273 * fVar216 * (float)local_700._4_4_ +
                 fVar273 * fVar225 * (float)local_720._4_4_;
    fStack_5f8 = fStack_898 * fVar211 * fVar278 +
                 fVar278 * fVar207 * fStack_6f8 + fVar278 * fVar209 * fStack_718;
    fStack_5f4 = fStack_894 * fVar214 * fVar283 +
                 fVar283 * fVar321 * fStack_6f4 + fVar283 * fVar213 * fStack_714;
    fStack_5f0 = fStack_890 * fVar231 * fVar288 +
                 fVar288 * fVar227 * fStack_6f0 + fVar288 * fVar230 * fStack_710;
    fStack_5ec = fStack_88c * fVar238 * fVar293 +
                 fVar293 * fVar235 * fStack_6ec + fVar293 * fVar237 * fStack_70c;
    fStack_5e8 = fStack_888 * fVar246 * fVar298 +
                 fVar298 * fVar242 * fStack_6e8 + fVar298 * fVar245 * fStack_708;
    fVar150 = fStack_884 + fStack_6e4 + fStack_704;
    local_620._0_4_ =
         fVar210 * fVar169 * fVar263 + fVar359 * fVar263 * fVar168 + fVar313 * fVar263 * fVar208;
    local_620._4_4_ =
         fVar233 * fVar229 * fVar273 + fVar363 * fVar273 * fVar216 + fVar315 * fVar273 * fVar225;
    local_620._8_4_ =
         fVar212 * fVar211 * fVar278 + fVar364 * fVar278 * fVar207 + fVar316 * fVar278 * fVar209;
    local_620._12_4_ =
         fVar226 * fVar214 * fVar283 + fVar365 * fVar283 * fVar321 + fVar317 * fVar283 * fVar213;
    local_620._16_4_ =
         fVar234 * fVar231 * fVar288 + fVar366 * fVar288 * fVar227 + fVar318 * fVar288 * fVar230;
    local_620._20_4_ =
         fVar241 * fVar238 * fVar293 + fVar367 * fVar293 * fVar235 + fVar319 * fVar293 * fVar237;
    local_620._24_4_ =
         fVar249 * fVar246 * fVar298 + fVar368 * fVar298 * fVar242 + fVar320 * fVar298 * fVar245;
    local_620._28_4_ = fStack_6e4 + fVar150;
    auVar33._4_4_ = fStack_5fc * local_620._4_4_;
    auVar33._0_4_ = local_600 * local_620._0_4_;
    auVar33._8_4_ = fStack_5f8 * local_620._8_4_;
    auVar33._12_4_ = fStack_5f4 * local_620._12_4_;
    auVar33._16_4_ = fStack_5f0 * local_620._16_4_;
    auVar33._20_4_ = fStack_5ec * local_620._20_4_;
    auVar33._24_4_ = fStack_5e8 * local_620._24_4_;
    auVar33._28_4_ = fVar150;
    auVar17 = vsubps_avx(auVar307,auVar33);
    auVar34._4_4_ = local_620._4_4_ * local_620._4_4_;
    auVar34._0_4_ = local_620._0_4_ * local_620._0_4_;
    auVar34._8_4_ = local_620._8_4_ * local_620._8_4_;
    auVar34._12_4_ = local_620._12_4_ * local_620._12_4_;
    auVar34._16_4_ = local_620._16_4_ * local_620._16_4_;
    auVar34._20_4_ = local_620._20_4_ * local_620._20_4_;
    auVar34._24_4_ = local_620._24_4_ * local_620._24_4_;
    auVar34._28_4_ = fStack_6e4;
    local_6a0 = vsubps_avx(auVar338,auVar34);
    local_2c0 = vsqrtps_avx(auVar122);
    fVar150 = (local_2c0._0_4_ + auVar97._0_4_) * 1.0000002;
    fVar257 = (local_2c0._4_4_ + auVar97._4_4_) * 1.0000002;
    fVar258 = (local_2c0._8_4_ + auVar97._8_4_) * 1.0000002;
    fVar259 = (local_2c0._12_4_ + auVar97._12_4_) * 1.0000002;
    fVar260 = (local_2c0._16_4_ + auVar97._16_4_) * 1.0000002;
    fVar261 = (local_2c0._20_4_ + auVar97._20_4_) * 1.0000002;
    fVar262 = (local_2c0._24_4_ + auVar97._24_4_) * 1.0000002;
    auVar35._4_4_ = fVar257 * fVar257;
    auVar35._0_4_ = fVar150 * fVar150;
    auVar35._8_4_ = fVar258 * fVar258;
    auVar35._12_4_ = fVar259 * fVar259;
    auVar35._16_4_ = fVar260 * fVar260;
    auVar35._20_4_ = fVar261 * fVar261;
    auVar35._24_4_ = fVar262 * fVar262;
    auVar35._28_4_ = local_2c0._28_4_ + auVar97._28_4_;
    auVar357._0_4_ = auVar17._0_4_ + auVar17._0_4_;
    auVar357._4_4_ = auVar17._4_4_ + auVar17._4_4_;
    auVar357._8_4_ = auVar17._8_4_ + auVar17._8_4_;
    auVar357._12_4_ = auVar17._12_4_ + auVar17._12_4_;
    auVar357._16_4_ = auVar17._16_4_ + auVar17._16_4_;
    auVar357._20_4_ = auVar17._20_4_ + auVar17._20_4_;
    auVar357._24_4_ = auVar17._24_4_ + auVar17._24_4_;
    fVar150 = auVar17._28_4_;
    auVar357._28_4_ = fVar150 + fVar150;
    auVar97 = vsubps_avx(local_6a0,auVar35);
    auVar36._4_4_ = fStack_5fc * fStack_5fc;
    auVar36._0_4_ = local_600 * local_600;
    auVar36._8_4_ = fStack_5f8 * fStack_5f8;
    auVar36._12_4_ = fStack_5f4 * fStack_5f4;
    auVar36._16_4_ = fStack_5f0 * fStack_5f0;
    auVar36._20_4_ = fStack_5ec * fStack_5ec;
    auVar36._24_4_ = fStack_5e8 * fStack_5e8;
    auVar36._28_4_ = fVar150;
    auVar17 = vsubps_avx(local_2a0,auVar36);
    local_6c0._4_4_ = auVar357._4_4_ * auVar357._4_4_;
    local_6c0._0_4_ = auVar357._0_4_ * auVar357._0_4_;
    local_6c0._8_4_ = auVar357._8_4_ * auVar357._8_4_;
    local_6c0._12_4_ = auVar357._12_4_ * auVar357._12_4_;
    local_6c0._16_4_ = auVar357._16_4_ * auVar357._16_4_;
    local_6c0._20_4_ = auVar357._20_4_ * auVar357._20_4_;
    local_6c0._24_4_ = auVar357._24_4_ * auVar357._24_4_;
    local_6c0._28_4_ = local_6a0._28_4_;
    fVar150 = auVar17._0_4_;
    local_6e0._0_4_ = fVar150 * 4.0;
    fVar257 = auVar17._4_4_;
    local_6e0._4_4_ = fVar257 * 4.0;
    fVar258 = auVar17._8_4_;
    fStack_6d8 = fVar258 * 4.0;
    fVar259 = auVar17._12_4_;
    fStack_6d4 = fVar259 * 4.0;
    fVar260 = auVar17._16_4_;
    fStack_6d0 = fVar260 * 4.0;
    fVar261 = auVar17._20_4_;
    fStack_6cc = fVar261 * 4.0;
    fVar262 = auVar17._24_4_;
    fStack_6c8 = fVar262 * 4.0;
    uStack_6c4 = 0x40800000;
    auVar37._4_4_ = auVar97._4_4_ * (float)local_6e0._4_4_;
    auVar37._0_4_ = auVar97._0_4_ * (float)local_6e0._0_4_;
    auVar37._8_4_ = auVar97._8_4_ * fStack_6d8;
    auVar37._12_4_ = auVar97._12_4_ * fStack_6d4;
    auVar37._16_4_ = auVar97._16_4_ * fStack_6d0;
    auVar37._20_4_ = auVar97._20_4_ * fStack_6cc;
    auVar37._24_4_ = auVar97._24_4_ * fStack_6c8;
    auVar37._28_4_ = 0x40800000;
    auVar14 = vsubps_avx(local_6c0,auVar37);
    auVar122 = vcmpps_avx(auVar14,auVar100,5);
    auVar124._8_4_ = 0x7fffffff;
    auVar124._0_8_ = 0x7fffffff7fffffff;
    auVar124._12_4_ = 0x7fffffff;
    auVar124._16_4_ = 0x7fffffff;
    auVar124._20_4_ = 0x7fffffff;
    auVar124._24_4_ = 0x7fffffff;
    auVar124._28_4_ = 0x7fffffff;
    local_980 = vandps_avx(auVar36,auVar124);
    local_300._0_4_ = fVar150 + fVar150;
    local_300._4_4_ = fVar257 + fVar257;
    local_300._8_4_ = fVar258 + fVar258;
    local_300._12_4_ = fVar259 + fVar259;
    local_300._16_4_ = fVar260 + fVar260;
    local_300._20_4_ = fVar261 + fVar261;
    local_300._24_4_ = fVar262 + fVar262;
    local_300._28_4_ = auVar17._28_4_ + auVar17._28_4_;
    local_960 = vandps_avx(auVar17,auVar124);
    uVar77 = CONCAT44(auVar357._4_4_,auVar357._0_4_);
    auVar222._0_8_ = uVar77 ^ 0x8000000080000000;
    auVar222._8_4_ = -auVar357._8_4_;
    auVar222._12_4_ = -auVar357._12_4_;
    auVar222._16_4_ = -auVar357._16_4_;
    auVar222._20_4_ = -auVar357._20_4_;
    auVar222._24_4_ = -auVar357._24_4_;
    auVar222._28_4_ = -auVar357._28_4_;
    if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar122 >> 0x7f,0) == '\0') &&
          (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar122 >> 0xbf,0) == '\0') &&
        (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar122[0x1f])
    {
      auVar164._8_4_ = 0x7f800000;
      auVar164._0_8_ = 0x7f8000007f800000;
      auVar164._12_4_ = 0x7f800000;
      auVar164._16_4_ = 0x7f800000;
      auVar164._20_4_ = 0x7f800000;
      auVar164._24_4_ = 0x7f800000;
      auVar164._28_4_ = 0x7f800000;
      auVar99._8_4_ = 0xff800000;
      auVar99._0_8_ = 0xff800000ff800000;
      auVar99._12_4_ = 0xff800000;
      auVar99._16_4_ = 0xff800000;
      auVar99._20_4_ = 0xff800000;
      auVar99._24_4_ = 0xff800000;
      auVar99._28_4_ = 0xff800000;
    }
    else {
      auVar16 = vsqrtps_avx(auVar14);
      auVar15 = vrcpps_avx(local_300);
      auVar17 = vcmpps_avx(auVar14,auVar100,5);
      fVar150 = auVar15._0_4_;
      fVar257 = auVar15._4_4_;
      auVar38._4_4_ = local_300._4_4_ * fVar257;
      auVar38._0_4_ = local_300._0_4_ * fVar150;
      fVar258 = auVar15._8_4_;
      auVar38._8_4_ = local_300._8_4_ * fVar258;
      fVar259 = auVar15._12_4_;
      auVar38._12_4_ = local_300._12_4_ * fVar259;
      fVar260 = auVar15._16_4_;
      auVar38._16_4_ = local_300._16_4_ * fVar260;
      fVar261 = auVar15._20_4_;
      auVar38._20_4_ = local_300._20_4_ * fVar261;
      fVar262 = auVar15._24_4_;
      auVar38._24_4_ = local_300._24_4_ * fVar262;
      auVar38._28_4_ = auVar14._28_4_;
      auVar125._8_4_ = 0x3f800000;
      auVar125._0_8_ = 0x3f8000003f800000;
      auVar125._12_4_ = 0x3f800000;
      auVar125._16_4_ = 0x3f800000;
      auVar125._20_4_ = 0x3f800000;
      auVar125._24_4_ = 0x3f800000;
      auVar125._28_4_ = 0x3f800000;
      auVar14 = vsubps_avx(auVar125,auVar38);
      fVar150 = fVar150 + fVar150 * auVar14._0_4_;
      fVar257 = fVar257 + fVar257 * auVar14._4_4_;
      fVar258 = fVar258 + fVar258 * auVar14._8_4_;
      fVar259 = fVar259 + fVar259 * auVar14._12_4_;
      fVar260 = fVar260 + fVar260 * auVar14._16_4_;
      fVar261 = fVar261 + fVar261 * auVar14._20_4_;
      fVar262 = fVar262 + fVar262 * auVar14._24_4_;
      auVar100 = vsubps_avx(auVar222,auVar16);
      fVar215 = auVar100._0_4_ * fVar150;
      fVar228 = auVar100._4_4_ * fVar257;
      auVar39._4_4_ = fVar228;
      auVar39._0_4_ = fVar215;
      fVar232 = auVar100._8_4_ * fVar258;
      auVar39._8_4_ = fVar232;
      fVar236 = auVar100._12_4_ * fVar259;
      auVar39._12_4_ = fVar236;
      fVar240 = auVar100._16_4_ * fVar260;
      auVar39._16_4_ = fVar240;
      fVar244 = auVar100._20_4_ * fVar261;
      auVar39._20_4_ = fVar244;
      fVar248 = auVar100._24_4_ * fVar262;
      auVar39._24_4_ = fVar248;
      auVar39._28_4_ = auVar100._28_4_;
      auVar100 = vsubps_avx(auVar16,auVar357);
      fVar150 = auVar100._0_4_ * fVar150;
      fVar257 = auVar100._4_4_ * fVar257;
      auVar40._4_4_ = fVar257;
      auVar40._0_4_ = fVar150;
      fVar258 = auVar100._8_4_ * fVar258;
      auVar40._8_4_ = fVar258;
      fVar259 = auVar100._12_4_ * fVar259;
      auVar40._12_4_ = fVar259;
      fVar260 = auVar100._16_4_ * fVar260;
      auVar40._16_4_ = fVar260;
      fVar261 = auVar100._20_4_ * fVar261;
      auVar40._20_4_ = fVar261;
      fVar262 = auVar100._24_4_ * fVar262;
      auVar40._24_4_ = fVar262;
      auVar40._28_4_ = auVar15._28_4_ + auVar14._28_4_;
      local_360 = fVar263 * (local_620._0_4_ + local_600 * fVar215);
      fStack_35c = fVar273 * (local_620._4_4_ + fStack_5fc * fVar228);
      fStack_358 = fVar278 * (local_620._8_4_ + fStack_5f8 * fVar232);
      fStack_354 = fVar283 * (local_620._12_4_ + fStack_5f4 * fVar236);
      fStack_350 = fVar288 * (local_620._16_4_ + fStack_5f0 * fVar240);
      fStack_34c = fVar293 * (local_620._20_4_ + fStack_5ec * fVar244);
      fStack_348 = fVar298 * (local_620._24_4_ + fStack_5e8 * fVar248);
      fStack_344 = local_300._28_4_;
      local_380 = fVar263 * (local_620._0_4_ + local_600 * fVar150);
      fStack_37c = fVar273 * (local_620._4_4_ + fStack_5fc * fVar257);
      fStack_378 = fVar278 * (local_620._8_4_ + fStack_5f8 * fVar258);
      fStack_374 = fVar283 * (local_620._12_4_ + fStack_5f4 * fVar259);
      fStack_370 = fVar288 * (local_620._16_4_ + fStack_5f0 * fVar260);
      fStack_36c = fVar293 * (local_620._20_4_ + fStack_5ec * fVar261);
      fStack_368 = fVar298 * (local_620._24_4_ + fStack_5e8 * fVar262);
      fStack_364 = local_300._28_4_;
      auVar197._8_4_ = 0x7f800000;
      auVar197._0_8_ = 0x7f8000007f800000;
      auVar197._12_4_ = 0x7f800000;
      auVar197._16_4_ = 0x7f800000;
      auVar197._20_4_ = 0x7f800000;
      auVar197._24_4_ = 0x7f800000;
      auVar197._28_4_ = 0x7f800000;
      auVar164 = vblendvps_avx(auVar197,auVar39,auVar17);
      auVar198._8_4_ = 0xff800000;
      auVar198._0_8_ = 0xff800000ff800000;
      auVar198._12_4_ = 0xff800000;
      auVar198._16_4_ = 0xff800000;
      auVar198._20_4_ = 0xff800000;
      auVar198._24_4_ = 0xff800000;
      auVar198._28_4_ = 0xff800000;
      auVar99 = vblendvps_avx(auVar198,auVar40,auVar17);
      auVar14 = vmaxps_avx(local_5c0,local_980);
      auVar41._4_4_ = auVar14._4_4_ * 1.9073486e-06;
      auVar41._0_4_ = auVar14._0_4_ * 1.9073486e-06;
      auVar41._8_4_ = auVar14._8_4_ * 1.9073486e-06;
      auVar41._12_4_ = auVar14._12_4_ * 1.9073486e-06;
      auVar41._16_4_ = auVar14._16_4_ * 1.9073486e-06;
      auVar41._20_4_ = auVar14._20_4_ * 1.9073486e-06;
      auVar41._24_4_ = auVar14._24_4_ * 1.9073486e-06;
      auVar41._28_4_ = auVar14._28_4_;
      auVar14 = vcmpps_avx(local_960,auVar41,1);
      auVar100 = auVar17 & auVar14;
      if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar100 >> 0x7f,0) != '\0') ||
            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar100 >> 0xbf,0) != '\0') ||
          (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar100[0x1f] < '\0') {
        auVar122 = vandps_avx(auVar14,auVar17);
        auVar155 = vpackssdw_avx(auVar122._0_16_,auVar122._16_16_);
        auVar14 = vcmpps_avx(auVar97,_DAT_01f7b000,2);
        auVar340._8_4_ = 0xff800000;
        auVar340._0_8_ = 0xff800000ff800000;
        auVar340._12_4_ = 0xff800000;
        auVar340._16_4_ = 0xff800000;
        auVar340._20_4_ = 0xff800000;
        auVar340._24_4_ = 0xff800000;
        auVar340._28_4_ = 0xff800000;
        auVar254._8_4_ = 0x7f800000;
        auVar254._0_8_ = 0x7f8000007f800000;
        auVar254._12_4_ = 0x7f800000;
        auVar254._16_4_ = 0x7f800000;
        auVar254._20_4_ = 0x7f800000;
        auVar254._24_4_ = 0x7f800000;
        auVar254._28_4_ = 0x7f800000;
        auVar97 = vblendvps_avx(auVar254,auVar340,auVar14);
        auVar84 = vpmovsxwd_avx(auVar155);
        auVar155 = vpunpckhwd_avx(auVar155,auVar155);
        auVar204._16_16_ = auVar155;
        auVar204._0_16_ = auVar84;
        auVar164 = vblendvps_avx(auVar164,auVar97,auVar204);
        auVar97 = vblendvps_avx(auVar340,auVar254,auVar14);
        auVar99 = vblendvps_avx(auVar99,auVar97,auVar204);
        auVar166._0_8_ = auVar122._0_8_ ^ 0xffffffffffffffff;
        auVar166._8_4_ = auVar122._8_4_ ^ 0xffffffff;
        auVar166._12_4_ = auVar122._12_4_ ^ 0xffffffff;
        auVar166._16_4_ = auVar122._16_4_ ^ 0xffffffff;
        auVar166._20_4_ = auVar122._20_4_ ^ 0xffffffff;
        auVar166._24_4_ = auVar122._24_4_ ^ 0xffffffff;
        auVar166._28_4_ = auVar122._28_4_ ^ 0xffffffff;
        auVar122 = vorps_avx(auVar14,auVar166);
        auVar122 = vandps_avx(auVar17,auVar122);
      }
    }
    auVar17 = local_560 & auVar122;
    auVar97 = auVar222;
    auVar339 = local_980;
    auVar323 = local_620;
    local_9a0 = _local_8a0;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar17 >> 0x7f,0) == '\0') &&
          (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar17 >> 0xbf,0) == '\0') &&
        (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar17[0x1f]) {
LAB_00855f58:
      auVar256 = ZEXT3264(local_9a0);
      auVar326 = ZEXT3264(auVar323);
      auVar341 = ZEXT3264(auVar339);
      auVar224 = ZEXT3264(auVar97);
      auVar205 = ZEXT3264(local_560);
    }
    else {
      fStack_5e4 = fStack_884 + fStack_6e4 + fStack_704;
      auVar310 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      auVar155 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8f0._0_4_));
      auVar155 = vshufps_avx(auVar155,auVar155,0);
      auVar199._16_16_ = auVar155;
      auVar199._0_16_ = auVar155;
      local_340 = vminps_avx(auVar199,auVar99);
      fVar215 = auVar222._28_4_ + auVar155._12_4_;
      auVar126._0_4_ =
           (float)local_8a0._0_4_ * fVar266 +
           (float)local_700._0_4_ * fVar322 + (float)local_720._0_4_ * fVar334;
      auVar126._4_4_ =
           (float)local_8a0._4_4_ * fVar276 +
           (float)local_700._4_4_ * fVar327 + (float)local_720._4_4_ * fVar342;
      auVar126._8_4_ = fStack_898 * fVar281 + fStack_6f8 * fVar328 + fStack_718 * fVar344;
      auVar126._12_4_ = fStack_894 * fVar286 + fStack_6f4 * fVar329 + fStack_714 * fVar346;
      auVar126._16_4_ = fStack_890 * fVar291 + fStack_6f0 * fVar330 + fStack_710 * fVar348;
      auVar126._20_4_ = fStack_88c * fVar296 + fStack_6ec * fVar331 + fStack_70c * fVar350;
      auVar126._24_4_ = fStack_888 * fVar301 + fStack_6e8 * fVar332 + fStack_708 * fVar352;
      auVar126._28_4_ = fStack_1c4 + fStack_204 + fStack_1c4;
      auVar97 = vrcpps_avx(auVar126);
      fVar150 = auVar97._0_4_;
      fVar257 = auVar97._4_4_;
      auVar42._4_4_ = auVar126._4_4_ * fVar257;
      auVar42._0_4_ = auVar126._0_4_ * fVar150;
      fVar258 = auVar97._8_4_;
      auVar42._8_4_ = auVar126._8_4_ * fVar258;
      fVar259 = auVar97._12_4_;
      auVar42._12_4_ = auVar126._12_4_ * fVar259;
      fVar260 = auVar97._16_4_;
      auVar42._16_4_ = auVar126._16_4_ * fVar260;
      fVar261 = auVar97._20_4_;
      auVar42._20_4_ = auVar126._20_4_ * fVar261;
      fVar262 = auVar97._24_4_;
      auVar42._24_4_ = auVar126._24_4_ * fVar262;
      auVar42._28_4_ = fVar215;
      auVar270._8_4_ = 0x3f800000;
      auVar270._0_8_ = 0x3f8000003f800000;
      auVar270._12_4_ = 0x3f800000;
      auVar270._16_4_ = 0x3f800000;
      auVar270._20_4_ = 0x3f800000;
      auVar270._24_4_ = 0x3f800000;
      auVar270._28_4_ = 0x3f800000;
      auVar14 = vsubps_avx(auVar270,auVar42);
      auVar253._8_4_ = 0x7fffffff;
      auVar253._0_8_ = 0x7fffffff7fffffff;
      auVar253._12_4_ = 0x7fffffff;
      auVar253._16_4_ = 0x7fffffff;
      auVar253._20_4_ = 0x7fffffff;
      auVar253._24_4_ = 0x7fffffff;
      auVar253._28_4_ = 0x7fffffff;
      auVar97 = vandps_avx(auVar126,auVar253);
      auVar361._8_4_ = 0x219392ef;
      auVar361._0_8_ = 0x219392ef219392ef;
      auVar361._12_4_ = 0x219392ef;
      auVar361._16_4_ = 0x219392ef;
      auVar361._20_4_ = 0x219392ef;
      auVar361._24_4_ = 0x219392ef;
      auVar361._28_4_ = 0x219392ef;
      auVar17 = vcmpps_avx(auVar97,auVar361,1);
      auVar43._4_4_ =
           (fVar257 + fVar257 * auVar14._4_4_) *
           -(fVar276 * fVar233 + fVar327 * fVar363 + fVar315 * fVar342);
      auVar43._0_4_ =
           (fVar150 + fVar150 * auVar14._0_4_) *
           -(fVar266 * fVar210 + fVar322 * fVar359 + fVar313 * fVar334);
      auVar43._8_4_ =
           (fVar258 + fVar258 * auVar14._8_4_) *
           -(fVar281 * fVar212 + fVar328 * fVar364 + fVar316 * fVar344);
      auVar43._12_4_ =
           (fVar259 + fVar259 * auVar14._12_4_) *
           -(fVar286 * fVar226 + fVar329 * fVar365 + fVar317 * fVar346);
      auVar43._16_4_ =
           (fVar260 + fVar260 * auVar14._16_4_) *
           -(fVar291 * fVar234 + fVar330 * fVar366 + fVar318 * fVar348);
      auVar43._20_4_ =
           (fVar261 + fVar261 * auVar14._20_4_) *
           -(fVar296 * fVar241 + fVar331 * fVar367 + fVar319 * fVar350);
      auVar43._24_4_ =
           (fVar262 + fVar262 * auVar14._24_4_) *
           -(fVar301 * fVar249 + fVar332 * fVar368 + fVar320 * fVar352);
      auVar43._28_4_ = -(auVar13._28_4_ + fVar215);
      auVar97 = vcmpps_avx(auVar126,ZEXT832(0) << 0x20,1);
      auVar97 = vorps_avx(auVar17,auVar97);
      auVar339._8_4_ = 0xff800000;
      auVar339._0_8_ = 0xff800000ff800000;
      auVar339._12_4_ = 0xff800000;
      auVar339._16_4_ = 0xff800000;
      auVar339._20_4_ = 0xff800000;
      auVar339._24_4_ = 0xff800000;
      auVar339._28_4_ = 0xff800000;
      auVar97 = vblendvps_avx(auVar43,auVar339,auVar97);
      auVar13 = vcmpps_avx(auVar126,ZEXT832(0) << 0x20,6);
      auVar17 = vorps_avx(auVar17,auVar13);
      auVar358._8_4_ = 0x7f800000;
      auVar358._0_8_ = 0x7f8000007f800000;
      auVar358._12_4_ = 0x7f800000;
      auVar358._16_4_ = 0x7f800000;
      auVar358._20_4_ = 0x7f800000;
      auVar358._24_4_ = 0x7f800000;
      auVar358._28_4_ = 0x7f800000;
      auVar17 = vblendvps_avx(auVar43,auVar358,auVar17);
      auVar13 = vmaxps_avx(local_320,auVar164);
      auVar13 = vmaxps_avx(auVar13,auVar97);
      auVar14 = vminps_avx(local_340,auVar17);
      auVar100 = ZEXT832(0) << 0x20;
      auVar97 = vsubps_avx(auVar100,auVar11);
      auVar17 = vsubps_avx(auVar100,local_a40);
      auVar44._4_4_ = auVar17._4_4_ * -fVar343;
      auVar44._0_4_ = auVar17._0_4_ * -fVar335;
      auVar44._8_4_ = auVar17._8_4_ * -fVar345;
      auVar44._12_4_ = auVar17._12_4_ * -fVar347;
      auVar44._16_4_ = auVar17._16_4_ * -fVar349;
      auVar44._20_4_ = auVar17._20_4_ * -fVar351;
      auVar44._24_4_ = auVar17._24_4_ * -fVar353;
      auVar44._28_4_ = auVar17._28_4_;
      auVar45._4_4_ = fVar311 * auVar97._4_4_;
      auVar45._0_4_ = fVar303 * auVar97._0_4_;
      auVar45._8_4_ = fVar312 * auVar97._8_4_;
      auVar45._12_4_ = fVar333 * auVar97._12_4_;
      auVar45._16_4_ = fVar239 * auVar97._16_4_;
      auVar45._20_4_ = fVar243 * auVar97._20_4_;
      auVar45._24_4_ = fVar247 * auVar97._24_4_;
      auVar45._28_4_ = auVar97._28_4_;
      auVar97 = vsubps_avx(auVar44,auVar45);
      auVar17 = vsubps_avx(auVar100,auVar12);
      auVar46._4_4_ = fVar277 * auVar17._4_4_;
      auVar46._0_4_ = fVar267 * auVar17._0_4_;
      auVar46._8_4_ = fVar282 * auVar17._8_4_;
      auVar46._12_4_ = fVar287 * auVar17._12_4_;
      auVar46._16_4_ = fVar292 * auVar17._16_4_;
      auVar46._20_4_ = fVar297 * auVar17._20_4_;
      uVar1 = auVar17._28_4_;
      auVar46._24_4_ = fVar302 * auVar17._24_4_;
      auVar46._28_4_ = uVar1;
      auVar17 = vsubps_avx(auVar97,auVar46);
      auVar47._4_4_ = (float)local_720._4_4_ * -fVar343;
      auVar47._0_4_ = (float)local_720._0_4_ * -fVar335;
      auVar47._8_4_ = fStack_718 * -fVar345;
      auVar47._12_4_ = fStack_714 * -fVar347;
      auVar47._16_4_ = fStack_710 * -fVar349;
      auVar47._20_4_ = fStack_70c * -fVar351;
      auVar47._24_4_ = fStack_708 * -fVar353;
      auVar47._28_4_ = uVar80 ^ 0x80000000;
      auVar323._8_4_ = 0x3f800000;
      auVar323._0_8_ = 0x3f8000003f800000;
      auVar323._12_4_ = 0x3f800000;
      auVar323._16_4_ = 0x3f800000;
      auVar323._20_4_ = 0x3f800000;
      auVar323._24_4_ = 0x3f800000;
      auVar323._28_4_ = 0x3f800000;
      auVar48._4_4_ = (float)local_700._4_4_ * fVar311;
      auVar48._0_4_ = (float)local_700._0_4_ * fVar303;
      auVar48._8_4_ = fStack_6f8 * fVar312;
      auVar48._12_4_ = fStack_6f4 * fVar333;
      auVar48._16_4_ = fStack_6f0 * fVar239;
      auVar48._20_4_ = fStack_6ec * fVar243;
      auVar48._24_4_ = fStack_6e8 * fVar247;
      auVar48._28_4_ = uVar1;
      auVar97 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = (float)local_8a0._4_4_ * fVar277;
      auVar49._0_4_ = (float)local_8a0._0_4_ * fVar267;
      auVar49._8_4_ = fStack_898 * fVar282;
      auVar49._12_4_ = fStack_894 * fVar287;
      auVar49._16_4_ = fStack_890 * fVar292;
      auVar49._20_4_ = fStack_88c * fVar297;
      auVar49._24_4_ = fStack_888 * fVar302;
      auVar49._28_4_ = uVar1;
      auVar11 = vsubps_avx(auVar97,auVar49);
      auVar97 = vrcpps_avx(auVar11);
      fVar150 = auVar97._0_4_;
      fVar210 = auVar97._4_4_;
      auVar50._4_4_ = auVar11._4_4_ * fVar210;
      auVar50._0_4_ = auVar11._0_4_ * fVar150;
      fVar233 = auVar97._8_4_;
      auVar50._8_4_ = auVar11._8_4_ * fVar233;
      fVar212 = auVar97._12_4_;
      auVar50._12_4_ = auVar11._12_4_ * fVar212;
      fVar226 = auVar97._16_4_;
      auVar50._16_4_ = auVar11._16_4_ * fVar226;
      fVar234 = auVar97._20_4_;
      auVar50._20_4_ = auVar11._20_4_ * fVar234;
      fVar241 = auVar97._24_4_;
      auVar50._24_4_ = auVar11._24_4_ * fVar241;
      auVar50._28_4_ = fStack_884;
      auVar12 = vsubps_avx(auVar323,auVar50);
      auVar97 = vandps_avx(auVar11,auVar253);
      auVar101._8_4_ = 0x219392ef;
      auVar101._0_8_ = 0x219392ef219392ef;
      auVar101._12_4_ = 0x219392ef;
      auVar101._16_4_ = 0x219392ef;
      auVar101._20_4_ = 0x219392ef;
      auVar101._24_4_ = 0x219392ef;
      auVar101._28_4_ = 0x219392ef;
      auVar97 = vcmpps_avx(auVar97,auVar101,1);
      auVar64 = ZEXT812(0);
      auVar314 = ZEXT1264(auVar64) << 0x20;
      auVar51._4_4_ = (fVar210 + fVar210 * auVar12._4_4_) * -auVar17._4_4_;
      auVar51._0_4_ = (fVar150 + fVar150 * auVar12._0_4_) * -auVar17._0_4_;
      auVar51._8_4_ = (fVar233 + fVar233 * auVar12._8_4_) * -auVar17._8_4_;
      auVar51._12_4_ = (fVar212 + fVar212 * auVar12._12_4_) * -auVar17._12_4_;
      auVar51._16_4_ = (fVar226 + fVar226 * auVar12._16_4_) * -auVar17._16_4_;
      auVar51._20_4_ = (fVar234 + fVar234 * auVar12._20_4_) * -auVar17._20_4_;
      auVar51._24_4_ = (fVar241 + fVar241 * auVar12._24_4_) * -auVar17._24_4_;
      auVar51._28_4_ = auVar17._28_4_ ^ 0x80000000;
      auVar17 = vcmpps_avx(auVar11,ZEXT1232(auVar64) << 0x20,1);
      auVar17 = vorps_avx(auVar97,auVar17);
      auVar17 = vblendvps_avx(auVar51,auVar339,auVar17);
      local_9a0 = vmaxps_avx(auVar13,auVar17);
      auVar17 = vcmpps_avx(auVar11,ZEXT1232(auVar64) << 0x20,6);
      auVar17 = vorps_avx(auVar97,auVar17);
      auVar17 = vblendvps_avx(auVar51,auVar358,auVar17);
      auVar122 = vandps_avx(local_560,auVar122);
      local_3a0 = vminps_avx(auVar14,auVar17);
      auVar17 = vcmpps_avx(local_9a0,local_3a0,2);
      auVar11 = auVar122 & auVar17;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar11 >> 0x7f,0) == '\0') &&
            (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar11 >> 0xbf,0) == '\0') &&
          (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar11[0x1f])
      goto LAB_00855f58;
      auVar97 = vminps_avx(_local_a80,auVar98);
      auVar11 = vminps_avx(local_660,local_680);
      auVar97 = vminps_avx(auVar97,auVar11);
      auVar11 = vsubps_avx(auVar97,local_2c0);
      auVar122 = vandps_avx(auVar17,auVar122);
      auVar73._4_4_ = fStack_35c;
      auVar73._0_4_ = local_360;
      auVar73._8_4_ = fStack_358;
      auVar73._12_4_ = fStack_354;
      auVar73._16_4_ = fStack_350;
      auVar73._20_4_ = fStack_34c;
      auVar73._24_4_ = fStack_348;
      auVar73._28_4_ = fStack_344;
      auVar97 = vminps_avx(auVar73,auVar323);
      auVar182 = SUB6428(ZEXT864(0),0) << 0x20;
      auVar97 = vmaxps_avx(auVar97,ZEXT832(0) << 0x20);
      local_1a0[0] = fVar370 + fVar206 * (auVar97._0_4_ + 0.0) * 0.125;
      local_1a0[1] = fVar371 + fVar170 * (auVar97._4_4_ + 1.0) * 0.125;
      local_1a0[2] = fVar372 + fVar107 * (auVar97._8_4_ + 2.0) * 0.125;
      local_1a0[3] = fVar149 + fVar171 * (auVar97._12_4_ + 3.0) * 0.125;
      fStack_190 = fVar370 + fVar206 * (auVar97._16_4_ + 4.0) * 0.125;
      fStack_18c = fVar371 + fVar170 * (auVar97._20_4_ + 5.0) * 0.125;
      fStack_188 = fVar372 + fVar107 * (auVar97._24_4_ + 6.0) * 0.125;
      fStack_184 = fVar149 + auVar97._28_4_ + 7.0;
      auVar72._4_4_ = fStack_37c;
      auVar72._0_4_ = local_380;
      auVar72._8_4_ = fStack_378;
      auVar72._12_4_ = fStack_374;
      auVar72._16_4_ = fStack_370;
      auVar72._20_4_ = fStack_36c;
      auVar72._24_4_ = fStack_368;
      auVar72._28_4_ = fStack_364;
      auVar97 = vminps_avx(auVar72,auVar323);
      auVar97 = vmaxps_avx(auVar97,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar370 + fVar206 * (auVar97._0_4_ + 0.0) * 0.125;
      local_1c0[1] = fVar371 + fVar170 * (auVar97._4_4_ + 1.0) * 0.125;
      local_1c0[2] = fVar372 + fVar107 * (auVar97._8_4_ + 2.0) * 0.125;
      local_1c0[3] = fVar149 + fVar171 * (auVar97._12_4_ + 3.0) * 0.125;
      fStack_1b0 = fVar370 + fVar206 * (auVar97._16_4_ + 4.0) * 0.125;
      fStack_1ac = fVar371 + fVar170 * (auVar97._20_4_ + 5.0) * 0.125;
      fStack_1a8 = fVar372 + fVar107 * (auVar97._24_4_ + 6.0) * 0.125;
      fStack_1a4 = fVar149 + auVar97._28_4_ + 7.0;
      auVar52._4_4_ = auVar11._4_4_ * 0.99999976;
      auVar52._0_4_ = auVar11._0_4_ * 0.99999976;
      auVar52._8_4_ = auVar11._8_4_ * 0.99999976;
      auVar52._12_4_ = auVar11._12_4_ * 0.99999976;
      auVar52._16_4_ = auVar11._16_4_ * 0.99999976;
      auVar52._20_4_ = auVar11._20_4_ * 0.99999976;
      auVar52._24_4_ = auVar11._24_4_ * 0.99999976;
      auVar52._28_4_ = 0x3f7ffffc;
      auVar97 = vmaxps_avx(ZEXT1232(auVar64) << 0x20,auVar52);
      auVar53._4_4_ = auVar97._4_4_ * auVar97._4_4_;
      auVar53._0_4_ = auVar97._0_4_ * auVar97._0_4_;
      auVar53._8_4_ = auVar97._8_4_ * auVar97._8_4_;
      auVar53._12_4_ = auVar97._12_4_ * auVar97._12_4_;
      auVar53._16_4_ = auVar97._16_4_ * auVar97._16_4_;
      auVar53._20_4_ = auVar97._20_4_ * auVar97._20_4_;
      auVar53._24_4_ = auVar97._24_4_ * auVar97._24_4_;
      auVar53._28_4_ = auVar97._28_4_;
      local_920 = vsubps_avx(local_6a0,auVar53);
      auVar54._4_4_ = local_920._4_4_ * (float)local_6e0._4_4_;
      auVar54._0_4_ = local_920._0_4_ * (float)local_6e0._0_4_;
      auVar54._8_4_ = local_920._8_4_ * fStack_6d8;
      auVar54._12_4_ = local_920._12_4_ * fStack_6d4;
      auVar54._16_4_ = local_920._16_4_ * fStack_6d0;
      auVar54._20_4_ = local_920._20_4_ * fStack_6cc;
      auVar54._24_4_ = local_920._24_4_ * fStack_6c8;
      auVar54._28_4_ = auVar97._28_4_;
      auVar17 = vsubps_avx(local_6c0,auVar54);
      auVar97 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,5);
      if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar97 >> 0x7f,0) == '\0') &&
            (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar97 >> 0xbf,0) == '\0') &&
          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar97[0x1f])
      {
        auVar224 = ZEXT864(0) << 0x20;
        auVar205 = ZEXT864(0) << 0x20;
        auVar341 = ZEXT864(0) << 0x20;
        auVar356 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar271._8_4_ = 0x7f800000;
        auVar271._0_8_ = 0x7f8000007f800000;
        auVar271._12_4_ = 0x7f800000;
        auVar271._16_4_ = 0x7f800000;
        auVar271._20_4_ = 0x7f800000;
        auVar271._24_4_ = 0x7f800000;
        auVar271._28_4_ = 0x7f800000;
        auVar324._8_4_ = 0xff800000;
        auVar324._0_8_ = 0xff800000ff800000;
        auVar324._12_4_ = 0xff800000;
        auVar324._16_4_ = 0xff800000;
        auVar324._20_4_ = 0xff800000;
        auVar324._24_4_ = 0xff800000;
        auVar324._28_4_ = 0xff800000;
        local_920 = auVar18;
      }
      else {
        auVar11 = vrcpps_avx(local_300);
        fVar150 = auVar11._0_4_;
        auVar184._0_4_ = local_300._0_4_ * fVar150;
        fVar206 = auVar11._4_4_;
        auVar184._4_4_ = local_300._4_4_ * fVar206;
        fVar210 = auVar11._8_4_;
        auVar184._8_4_ = local_300._8_4_ * fVar210;
        fVar170 = auVar11._12_4_;
        auVar184._12_4_ = local_300._12_4_ * fVar170;
        fVar233 = auVar11._16_4_;
        auVar184._16_4_ = local_300._16_4_ * fVar233;
        fVar107 = auVar11._20_4_;
        auVar184._20_4_ = local_300._20_4_ * fVar107;
        fVar212 = auVar11._24_4_;
        auVar184._24_4_ = local_300._24_4_ * fVar212;
        auVar184._28_4_ = 0;
        auVar13 = vsubps_avx(auVar323,auVar184);
        auVar12 = vsqrtps_avx(auVar17);
        fVar150 = fVar150 + fVar150 * auVar13._0_4_;
        fVar206 = fVar206 + fVar206 * auVar13._4_4_;
        fVar210 = fVar210 + fVar210 * auVar13._8_4_;
        fVar170 = fVar170 + fVar170 * auVar13._12_4_;
        fVar233 = fVar233 + fVar233 * auVar13._16_4_;
        fVar107 = fVar107 + fVar107 * auVar13._20_4_;
        fVar212 = fVar212 + fVar212 * auVar13._24_4_;
        auVar14 = vsubps_avx(auVar222,auVar12);
        fVar259 = auVar14._0_4_ * fVar150;
        fVar260 = auVar14._4_4_ * fVar206;
        auVar55._4_4_ = fVar260;
        auVar55._0_4_ = fVar259;
        fVar261 = auVar14._8_4_ * fVar210;
        auVar55._8_4_ = fVar261;
        fVar262 = auVar14._12_4_ * fVar170;
        auVar55._12_4_ = fVar262;
        fVar370 = auVar14._16_4_ * fVar233;
        auVar55._16_4_ = fVar370;
        fVar371 = auVar14._20_4_ * fVar107;
        auVar55._20_4_ = fVar371;
        fVar372 = auVar14._24_4_ * fVar212;
        auVar55._24_4_ = fVar372;
        auVar55._28_4_ = fVar369;
        auVar14 = vsubps_avx(auVar12,auVar357);
        fVar150 = auVar14._0_4_ * fVar150;
        fVar206 = auVar14._4_4_ * fVar206;
        auVar56._4_4_ = fVar206;
        auVar56._0_4_ = fVar150;
        fVar210 = auVar14._8_4_ * fVar210;
        auVar56._8_4_ = fVar210;
        fVar170 = auVar14._12_4_ * fVar170;
        auVar56._12_4_ = fVar170;
        fVar233 = auVar14._16_4_ * fVar233;
        auVar56._16_4_ = fVar233;
        fVar107 = auVar14._20_4_ * fVar107;
        auVar56._20_4_ = fVar107;
        fVar212 = auVar14._24_4_ * fVar212;
        auVar56._24_4_ = fVar212;
        auVar56._28_4_ = local_9a0._28_4_;
        fVar171 = (fVar259 * local_600 + local_620._0_4_) * fVar263;
        fVar226 = (fVar260 * fStack_5fc + local_620._4_4_) * fVar273;
        fVar234 = (fVar261 * fStack_5f8 + local_620._8_4_) * fVar278;
        fVar241 = (fVar262 * fStack_5f4 + local_620._12_4_) * fVar283;
        fVar249 = (fVar370 * fStack_5f0 + local_620._16_4_) * fVar288;
        fVar257 = (fVar371 * fStack_5ec + local_620._20_4_) * fVar293;
        fVar258 = (fVar372 * fStack_5e8 + local_620._24_4_) * fVar298;
        auVar103._0_4_ = fVar264 + fVar171 * fVar169;
        auVar103._4_4_ = fVar274 + fVar226 * fVar229;
        auVar103._8_4_ = fVar279 + fVar234 * fVar211;
        auVar103._12_4_ = fVar284 + fVar241 * fVar214;
        auVar103._16_4_ = fVar289 + fVar249 * fVar231;
        auVar103._20_4_ = fVar294 + fVar257 * fVar238;
        auVar103._24_4_ = fVar299 + fVar258 * fVar246;
        auVar103._28_4_ = fVar304 + auVar11._28_4_ + auVar13._28_4_ + local_620._28_4_;
        auVar57._4_4_ = (float)local_8a0._4_4_ * fVar260;
        auVar57._0_4_ = (float)local_8a0._0_4_ * fVar259;
        auVar57._8_4_ = fStack_898 * fVar261;
        auVar57._12_4_ = fStack_894 * fVar262;
        auVar57._16_4_ = fStack_890 * fVar370;
        auVar57._20_4_ = fStack_88c * fVar371;
        auVar57._24_4_ = fStack_888 * fVar372;
        auVar57._28_4_ = auVar12._28_4_;
        _local_a80 = vsubps_avx(auVar57,auVar103);
        auVar200._0_4_ = fVar265 + fVar171 * fVar168;
        auVar200._4_4_ = fVar275 + fVar226 * fVar216;
        auVar200._8_4_ = fVar280 + fVar234 * fVar207;
        auVar200._12_4_ = fVar285 + fVar241 * fVar321;
        auVar200._16_4_ = fVar290 + fVar249 * fVar227;
        auVar200._20_4_ = fVar295 + fVar257 * fVar235;
        auVar200._24_4_ = fVar300 + fVar258 * fVar242;
        auVar200._28_4_ = fVar305 + auVar12._28_4_;
        auVar58._4_4_ = fVar260 * (float)local_700._4_4_;
        auVar58._0_4_ = fVar259 * (float)local_700._0_4_;
        auVar58._8_4_ = fVar261 * fStack_6f8;
        auVar58._12_4_ = fVar262 * fStack_6f4;
        auVar58._16_4_ = fVar370 * fStack_6f0;
        auVar58._20_4_ = fVar371 * fStack_6ec;
        auVar58._24_4_ = fVar372 * fStack_6e8;
        auVar58._28_4_ = 0x3e000000;
        auVar12 = vsubps_avx(auVar58,auVar200);
        auVar185._0_4_ = local_940 + fVar208 * fVar171;
        auVar185._4_4_ = fStack_93c + fVar225 * fVar226;
        auVar185._8_4_ = fStack_938 + fVar209 * fVar234;
        auVar185._12_4_ = fStack_934 + fVar213 * fVar241;
        auVar185._16_4_ = fStack_930 + fVar230 * fVar249;
        auVar185._20_4_ = fStack_92c + fVar237 * fVar257;
        auVar185._24_4_ = fStack_928 + fVar245 * fVar258;
        auVar185._28_4_ = fStack_924 + auVar14._28_4_;
        auVar59._4_4_ = (float)local_720._4_4_ * fVar260;
        auVar59._0_4_ = (float)local_720._0_4_ * fVar259;
        auVar59._8_4_ = fStack_718 * fVar261;
        auVar59._12_4_ = fStack_714 * fVar262;
        auVar59._16_4_ = fStack_710 * fVar370;
        auVar59._20_4_ = fStack_70c * fVar371;
        auVar59._24_4_ = fStack_708 * fVar372;
        auVar59._28_4_ = auVar12._28_4_;
        local_a40 = vsubps_avx(auVar59,auVar185);
        fVar263 = (fVar150 * local_600 + local_620._0_4_) * fVar263;
        fVar273 = (fVar206 * fStack_5fc + local_620._4_4_) * fVar273;
        fVar278 = (fVar210 * fStack_5f8 + local_620._8_4_) * fVar278;
        fVar283 = (fVar170 * fStack_5f4 + local_620._12_4_) * fVar283;
        fVar288 = (fVar233 * fStack_5f0 + local_620._16_4_) * fVar288;
        fVar293 = (fVar107 * fStack_5ec + local_620._20_4_) * fVar293;
        fVar298 = (fVar212 * fStack_5e8 + local_620._24_4_) * fVar298;
        auVar186._0_4_ = fVar264 + fVar263 * fVar169;
        auVar186._4_4_ = fVar274 + fVar273 * fVar229;
        auVar186._8_4_ = fVar279 + fVar278 * fVar211;
        auVar186._12_4_ = fVar284 + fVar283 * fVar214;
        auVar186._16_4_ = fVar289 + fVar288 * fVar231;
        auVar186._20_4_ = fVar294 + fVar293 * fVar238;
        auVar186._24_4_ = fVar299 + fVar298 * fVar246;
        auVar186._28_4_ = fVar304 + local_a40._28_4_ + local_620._28_4_;
        auVar60._4_4_ = (float)local_8a0._4_4_ * fVar206;
        auVar60._0_4_ = (float)local_8a0._0_4_ * fVar150;
        auVar60._8_4_ = fStack_898 * fVar210;
        auVar60._12_4_ = fStack_894 * fVar170;
        auVar60._16_4_ = fStack_890 * fVar233;
        auVar60._20_4_ = fStack_88c * fVar107;
        auVar60._24_4_ = fStack_888 * fVar212;
        auVar60._28_4_ = 0x3e000000;
        auVar11 = vsubps_avx(auVar60,auVar186);
        auVar182 = auVar11._0_28_;
        auVar223._0_4_ = fVar265 + fVar263 * fVar168;
        auVar223._4_4_ = fVar275 + fVar273 * fVar216;
        auVar223._8_4_ = fVar280 + fVar278 * fVar207;
        auVar223._12_4_ = fVar285 + fVar283 * fVar321;
        auVar223._16_4_ = fVar290 + fVar288 * fVar227;
        auVar223._20_4_ = fVar295 + fVar293 * fVar235;
        auVar223._24_4_ = fVar300 + fVar298 * fVar242;
        auVar223._28_4_ = fVar305 + 0.125;
        auVar61._4_4_ = (float)local_700._4_4_ * fVar206;
        auVar61._0_4_ = (float)local_700._0_4_ * fVar150;
        auVar61._8_4_ = fStack_6f8 * fVar210;
        auVar61._12_4_ = fStack_6f4 * fVar170;
        auVar61._16_4_ = fStack_6f0 * fVar233;
        auVar61._20_4_ = fStack_6ec * fVar107;
        auVar61._24_4_ = fStack_6e8 * fVar212;
        auVar61._28_4_ = fStack_884;
        auVar11 = vsubps_avx(auVar61,auVar223);
        auVar224 = ZEXT3264(auVar11);
        auVar201._0_4_ = local_940 + fVar208 * fVar263;
        auVar201._4_4_ = fStack_93c + fVar225 * fVar273;
        auVar201._8_4_ = fStack_938 + fVar209 * fVar278;
        auVar201._12_4_ = fStack_934 + fVar213 * fVar283;
        auVar201._16_4_ = fStack_930 + fVar230 * fVar288;
        auVar201._20_4_ = fStack_92c + fVar237 * fVar293;
        auVar201._24_4_ = fStack_928 + fVar245 * fVar298;
        auVar201._28_4_ = fStack_924 + auVar12._28_4_;
        auVar62._4_4_ = (float)local_720._4_4_ * fVar206;
        auVar62._0_4_ = (float)local_720._0_4_ * fVar150;
        auVar62._8_4_ = fStack_718 * fVar210;
        auVar62._12_4_ = fStack_714 * fVar170;
        auVar62._16_4_ = fStack_710 * fVar233;
        auVar62._20_4_ = fStack_70c * fVar107;
        auVar62._24_4_ = fStack_708 * fVar212;
        auVar62._28_4_ = fStack_884;
        auVar11 = vsubps_avx(auVar62,auVar201);
        auVar205 = ZEXT3264(auVar11);
        auVar17 = vcmpps_avx(auVar17,_DAT_01f7b000,5);
        auVar272._8_4_ = 0x7f800000;
        auVar272._0_8_ = 0x7f8000007f800000;
        auVar272._12_4_ = 0x7f800000;
        auVar272._16_4_ = 0x7f800000;
        auVar272._20_4_ = 0x7f800000;
        auVar272._24_4_ = 0x7f800000;
        auVar272._28_4_ = 0x7f800000;
        auVar271 = vblendvps_avx(auVar272,auVar55,auVar17);
        auVar11 = vmaxps_avx(local_5c0,local_980);
        auVar63._4_4_ = auVar11._4_4_ * 1.9073486e-06;
        auVar63._0_4_ = auVar11._0_4_ * 1.9073486e-06;
        auVar63._8_4_ = auVar11._8_4_ * 1.9073486e-06;
        auVar63._12_4_ = auVar11._12_4_ * 1.9073486e-06;
        auVar63._16_4_ = auVar11._16_4_ * 1.9073486e-06;
        auVar63._20_4_ = auVar11._20_4_ * 1.9073486e-06;
        auVar63._24_4_ = auVar11._24_4_ * 1.9073486e-06;
        auVar63._28_4_ = auVar11._28_4_;
        auVar11 = vcmpps_avx(local_960,auVar63,1);
        auVar325._8_4_ = 0xff800000;
        auVar325._0_8_ = 0xff800000ff800000;
        auVar325._12_4_ = 0xff800000;
        auVar325._16_4_ = 0xff800000;
        auVar325._20_4_ = 0xff800000;
        auVar325._24_4_ = 0xff800000;
        auVar325._28_4_ = 0xff800000;
        auVar324 = vblendvps_avx(auVar325,auVar56,auVar17);
        auVar13 = auVar17 & auVar11;
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0x7f,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0xbf,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar13[0x1f] < '\0') {
          auVar97 = vandps_avx(auVar11,auVar17);
          auVar155 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
          auVar13 = vcmpps_avx(local_920,_DAT_01f7b000,2);
          auVar148._8_4_ = 0xff800000;
          auVar148._0_8_ = 0xff800000ff800000;
          auVar148._12_4_ = 0xff800000;
          auVar148._16_4_ = 0xff800000;
          auVar148._20_4_ = 0xff800000;
          auVar148._24_4_ = 0xff800000;
          auVar148._28_4_ = 0xff800000;
          auVar255._8_4_ = 0x7f800000;
          auVar255._0_8_ = 0x7f8000007f800000;
          auVar255._12_4_ = 0x7f800000;
          auVar255._16_4_ = 0x7f800000;
          auVar255._20_4_ = 0x7f800000;
          auVar255._24_4_ = 0x7f800000;
          auVar255._28_4_ = 0x7f800000;
          auVar11 = vblendvps_avx(auVar255,auVar148,auVar13);
          auVar84 = vpmovsxwd_avx(auVar155);
          auVar155 = vpunpckhwd_avx(auVar155,auVar155);
          auVar362._16_16_ = auVar155;
          auVar362._0_16_ = auVar84;
          auVar271 = vblendvps_avx(auVar271,auVar11,auVar362);
          auVar11 = vblendvps_avx(auVar148,auVar255,auVar13);
          auVar324 = vblendvps_avx(auVar324,auVar11,auVar362);
          auVar167._0_8_ = auVar97._0_8_ ^ 0xffffffffffffffff;
          auVar167._8_4_ = auVar97._8_4_ ^ 0xffffffff;
          auVar167._12_4_ = auVar97._12_4_ ^ 0xffffffff;
          auVar167._16_4_ = auVar97._16_4_ ^ 0xffffffff;
          auVar167._20_4_ = auVar97._20_4_ ^ 0xffffffff;
          auVar167._24_4_ = auVar97._24_4_ ^ 0xffffffff;
          auVar167._28_4_ = auVar97._28_4_ ^ 0xffffffff;
          auVar97 = vorps_avx(auVar13,auVar167);
          auVar97 = vandps_avx(auVar17,auVar97);
        }
        auVar314 = ZEXT3264(_local_a80);
        auVar341 = ZEXT3264(auVar12);
        auVar356 = local_a40._0_28_;
      }
      auVar256 = ZEXT3264(local_9a0);
      _local_400 = local_9a0;
      local_3e0 = vminps_avx(local_3a0,auVar271);
      _local_9c0 = vmaxps_avx(local_9a0,auVar324);
      auVar326 = ZEXT3264(_local_9c0);
      _local_3c0 = _local_9c0;
      auVar17 = vcmpps_avx(local_9a0,local_3e0,2);
      local_660 = vandps_avx(auVar17,auVar122);
      auVar17 = vcmpps_avx(_local_9c0,local_3a0,2);
      local_840 = vandps_avx(auVar122,auVar17);
      auVar122 = vorps_avx(local_840,local_660);
      if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar122 >> 0x7f,0) != '\0') ||
            (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar122 >> 0xbf,0) != '\0') ||
          (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar122[0x1f] < '\0') {
        auStack_8b8 = auVar123._8_24_;
        auVar256 = ZEXT3264(_local_720);
        auVar145._0_8_ = auVar97._0_8_ ^ 0xffffffffffffffff;
        auVar145._8_4_ = auVar97._8_4_ ^ 0xffffffff;
        auVar145._12_4_ = auVar97._12_4_ ^ 0xffffffff;
        auVar145._16_4_ = auVar97._16_4_ ^ 0xffffffff;
        auVar145._20_4_ = auVar97._20_4_ ^ 0xffffffff;
        auVar145._24_4_ = auVar97._24_4_ ^ 0xffffffff;
        fVar150 = auVar97._28_4_;
        auVar145._28_4_ = (uint)fVar150 ^ 0xffffffff;
        auVar127._0_4_ =
             (float)local_8a0._0_4_ * auVar182._0_4_ +
             (float)local_700._0_4_ * auVar224._0_4_ + (float)local_720._0_4_ * auVar205._0_4_;
        auVar127._4_4_ =
             (float)local_8a0._4_4_ * auVar182._4_4_ +
             (float)local_700._4_4_ * auVar224._4_4_ + (float)local_720._4_4_ * auVar205._4_4_;
        auVar127._8_4_ =
             fStack_898 * auVar182._8_4_ + fStack_6f8 * auVar224._8_4_ + fStack_718 * auVar205._8_4_
        ;
        auVar127._12_4_ =
             fStack_894 * auVar182._12_4_ +
             fStack_6f4 * auVar224._12_4_ + fStack_714 * auVar205._12_4_;
        auVar127._16_4_ =
             fStack_890 * auVar182._16_4_ +
             fStack_6f0 * auVar224._16_4_ + fStack_710 * auVar205._16_4_;
        auVar127._20_4_ =
             fStack_88c * auVar182._20_4_ +
             fStack_6ec * auVar224._20_4_ + fStack_70c * auVar205._20_4_;
        auVar127._24_4_ =
             fStack_888 * auVar182._24_4_ +
             fStack_6e8 * auVar224._24_4_ + fStack_708 * auVar205._24_4_;
        auVar127._28_4_ = fVar150 + local_840._28_4_ + auVar122._28_4_;
        auVar187._8_4_ = 0x7fffffff;
        auVar187._0_8_ = 0x7fffffff7fffffff;
        auVar187._12_4_ = 0x7fffffff;
        auVar187._16_4_ = 0x7fffffff;
        auVar187._20_4_ = 0x7fffffff;
        auVar187._24_4_ = 0x7fffffff;
        auVar187._28_4_ = 0x7fffffff;
        auVar122 = vandps_avx(auVar127,auVar187);
        auVar202._8_4_ = 0x3e99999a;
        auVar202._0_8_ = 0x3e99999a3e99999a;
        auVar202._12_4_ = 0x3e99999a;
        auVar202._16_4_ = 0x3e99999a;
        auVar202._20_4_ = 0x3e99999a;
        auVar202._24_4_ = 0x3e99999a;
        auVar202._28_4_ = 0x3e99999a;
        auVar122 = vcmpps_avx(auVar122,auVar202,1);
        local_6a0 = vorps_avx(auVar122,auVar145);
        auVar326 = ZEXT3264(local_660);
        auVar104._0_4_ =
             auVar314._0_4_ * (float)local_8a0._0_4_ +
             (float)local_700._0_4_ * auVar341._0_4_ + auVar356._0_4_ * (float)local_720._0_4_;
        auVar104._4_4_ =
             auVar314._4_4_ * (float)local_8a0._4_4_ +
             (float)local_700._4_4_ * auVar341._4_4_ + auVar356._4_4_ * (float)local_720._4_4_;
        auVar104._8_4_ =
             auVar314._8_4_ * fStack_898 + fStack_6f8 * auVar341._8_4_ + auVar356._8_4_ * fStack_718
        ;
        auVar104._12_4_ =
             auVar314._12_4_ * fStack_894 +
             fStack_6f4 * auVar341._12_4_ + auVar356._12_4_ * fStack_714;
        auVar104._16_4_ =
             auVar314._16_4_ * fStack_890 +
             fStack_6f0 * auVar341._16_4_ + auVar356._16_4_ * fStack_710;
        auVar104._20_4_ =
             auVar314._20_4_ * fStack_88c +
             fStack_6ec * auVar341._20_4_ + auVar356._20_4_ * fStack_70c;
        auVar104._24_4_ =
             auVar314._24_4_ * fStack_888 +
             fStack_6e8 * auVar341._24_4_ + auVar356._24_4_ * fStack_708;
        auVar104._28_4_ = local_660._28_4_ + local_6a0._28_4_ + fVar150;
        auVar122 = vandps_avx(auVar104,auVar187);
        auVar122 = vcmpps_avx(auVar122,auVar202,1);
        auVar122 = vorps_avx(auVar122,auVar145);
        auVar128._8_4_ = 3;
        auVar128._0_8_ = 0x300000003;
        auVar128._12_4_ = 3;
        auVar128._16_4_ = 3;
        auVar128._20_4_ = 3;
        auVar128._24_4_ = 3;
        auVar128._28_4_ = 3;
        auVar146._8_4_ = 2;
        auVar146._0_8_ = 0x200000002;
        auVar146._12_4_ = 2;
        auVar146._16_4_ = 2;
        auVar146._20_4_ = 2;
        auVar146._24_4_ = 2;
        auVar146._28_4_ = 2;
        auVar122 = vblendvps_avx(auVar146,auVar128,auVar122);
        local_6c0 = ZEXT432(local_c48);
        _local_6e0 = vpshufd_avx(ZEXT416(local_c48),0);
        auVar155 = vpcmpgtd_avx(auVar122._16_16_,_local_6e0);
        auVar84 = vpcmpgtd_avx(auVar122._0_16_,_local_6e0);
        auVar129._16_16_ = auVar155;
        auVar129._0_16_ = auVar84;
        local_680 = vblendps_avx(ZEXT1632(auVar84),auVar129,0xf0);
        auVar122 = vandnps_avx(local_680,local_660);
        local_9e0._4_4_ = (float)local_880._4_4_ + local_9a0._4_4_;
        local_9e0._0_4_ = (float)local_880._0_4_ + local_9a0._0_4_;
        fStack_9d8 = fStack_878 + local_9a0._8_4_;
        fStack_9d4 = fStack_874 + local_9a0._12_4_;
        fStack_9d0 = fStack_870 + local_9a0._16_4_;
        fStack_9cc = fStack_86c + local_9a0._20_4_;
        fStack_9c8 = fStack_868 + local_9a0._24_4_;
        fStack_9c4 = fStack_864 + local_9a0._28_4_;
        while( true ) {
          auVar224 = ZEXT3264(local_9a0);
          local_420 = auVar122;
          local_af0 = auVar9._0_4_;
          fStack_aec = auVar9._4_4_;
          fStack_ae8 = auVar9._8_4_;
          fStack_ae4 = auVar9._12_4_;
          local_ad0 = auVar85._0_4_;
          fStack_acc = auVar85._4_4_;
          fStack_ac8 = auVar85._8_4_;
          fStack_ac4 = auVar85._12_4_;
          local_ae0 = auVar108._0_4_;
          fStack_adc = auVar108._4_4_;
          fStack_ad8 = auVar108._8_4_;
          fStack_ad4 = auVar108._12_4_;
          local_ac0 = auVar10._0_4_;
          fStack_abc = auVar10._4_4_;
          fStack_ab8 = auVar10._8_4_;
          fStack_ab4 = auVar10._12_4_;
          if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar122 >> 0x7f,0) == '\0') &&
                (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar122 >> 0xbf,0) == '\0') &&
              (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar122[0x1f]) break;
          auVar130._8_4_ = 0x7f800000;
          auVar130._0_8_ = 0x7f8000007f800000;
          auVar130._12_4_ = 0x7f800000;
          auVar130._16_4_ = 0x7f800000;
          auVar130._20_4_ = 0x7f800000;
          auVar130._24_4_ = 0x7f800000;
          auVar130._28_4_ = 0x7f800000;
          auVar97 = vblendvps_avx(auVar130,local_9a0,auVar122);
          auVar17 = vshufps_avx(auVar97,auVar97,0xb1);
          auVar17 = vminps_avx(auVar97,auVar17);
          auVar11 = vshufpd_avx(auVar17,auVar17,5);
          auVar17 = vminps_avx(auVar17,auVar11);
          auVar11 = vperm2f128_avx(auVar17,auVar17,1);
          auVar17 = vminps_avx(auVar17,auVar11);
          auVar97 = vcmpps_avx(auVar97,auVar17,0);
          auVar17 = auVar122 & auVar97;
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0x7f,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0xbf,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar17[0x1f] < '\0') {
            auVar122 = vandps_avx(auVar97,auVar122);
          }
          uVar75 = vmovmskps_avx(auVar122);
          uVar80 = 0;
          if (uVar75 != 0) {
            for (; (uVar75 >> uVar80 & 1) == 0; uVar80 = uVar80 + 1) {
            }
          }
          uVar77 = (ulong)uVar80;
          *(undefined4 *)(local_420 + uVar77 * 4) = 0;
          fVar150 = local_1a0[uVar77];
          uVar80 = *(uint *)(local_400 + uVar77 * 4);
          fVar206 = auVar109._0_4_;
          if ((float)local_a00._0_4_ < 0.0) {
            auVar314 = ZEXT1664(auVar314._0_16_);
            auVar326 = ZEXT1664(auVar326._0_16_);
            auVar341 = ZEXT1664(auVar341._0_16_);
            fVar206 = sqrtf((float)local_a00._0_4_);
          }
          auVar256 = ZEXT464(uVar80);
          auVar84 = vminps_avx(auVar10,auVar108);
          auVar155 = vmaxps_avx(auVar10,auVar108);
          auVar83 = vminps_avx(auVar85,auVar9);
          auVar89 = vminps_avx(auVar84,auVar83);
          auVar84 = vmaxps_avx(auVar85,auVar9);
          auVar83 = vmaxps_avx(auVar155,auVar84);
          auVar152._8_4_ = 0x7fffffff;
          auVar152._0_8_ = 0x7fffffff7fffffff;
          auVar152._12_4_ = 0x7fffffff;
          auVar155 = vandps_avx(auVar89,auVar152);
          auVar84 = vandps_avx(auVar83,auVar152);
          auVar155 = vmaxps_avx(auVar155,auVar84);
          auVar84 = vmovshdup_avx(auVar155);
          auVar84 = vmaxss_avx(auVar84,auVar155);
          auVar155 = vshufpd_avx(auVar155,auVar155,1);
          auVar155 = vmaxss_avx(auVar155,auVar84);
          local_a80._0_4_ = auVar155._0_4_ * 1.9073486e-06;
          local_920._0_4_ = fVar206 * 1.9073486e-06;
          local_980._0_16_ = vshufps_avx(auVar83,auVar83,0xff);
          auVar155 = vinsertps_avx(ZEXT416(uVar80),ZEXT416((uint)fVar150),0x10);
          auVar205 = ZEXT1664(auVar155);
          lVar76 = 5;
          do {
            do {
              auVar155 = auVar205._0_16_;
              bVar82 = lVar76 == 0;
              lVar76 = lVar76 + -1;
              if (bVar82) goto LAB_00856d97;
              auVar84 = vmovshdup_avx(auVar155);
              fVar150 = auVar84._0_4_;
              fVar169 = 1.0 - fVar150;
              fVar206 = fVar169 * fVar169 * fVar169;
              fVar168 = fVar150 * fVar150 * fVar150;
              fVar208 = fVar150 * fVar169;
              auVar84 = vshufps_avx(ZEXT416((uint)(fVar168 * 0.16666667)),
                                    ZEXT416((uint)(fVar168 * 0.16666667)),0);
              auVar83 = ZEXT416((uint)((fVar168 * 4.0 + fVar206 +
                                       fVar150 * fVar208 * 12.0 + fVar169 * fVar208 * 6.0) *
                                      0.16666667));
              auVar83 = vshufps_avx(auVar83,auVar83,0);
              auVar89 = ZEXT416((uint)((fVar206 * 4.0 + fVar168 +
                                       fVar169 * fVar208 * 12.0 + fVar150 * fVar208 * 6.0) *
                                      0.16666667));
              auVar89 = vshufps_avx(auVar89,auVar89,0);
              auVar111 = vshufps_avx(auVar155,auVar155,0);
              auVar137._0_4_ = auVar111._0_4_ * (float)local_9f0._0_4_ + 0.0;
              auVar137._4_4_ = auVar111._4_4_ * (float)local_9f0._4_4_ + 0.0;
              auVar137._8_4_ = auVar111._8_4_ * fStack_9e8 + 0.0;
              auVar137._12_4_ = auVar111._12_4_ * fStack_9e4 + 0.0;
              auVar111 = vshufps_avx(ZEXT416((uint)(fVar206 * 0.16666667)),
                                     ZEXT416((uint)(fVar206 * 0.16666667)),0);
              auVar87._0_4_ =
                   auVar111._0_4_ * local_ac0 +
                   auVar89._0_4_ * local_ae0 + auVar84._0_4_ * local_af0 + auVar83._0_4_ * local_ad0
              ;
              auVar87._4_4_ =
                   auVar111._4_4_ * fStack_abc +
                   auVar89._4_4_ * fStack_adc +
                   auVar84._4_4_ * fStack_aec + auVar83._4_4_ * fStack_acc;
              auVar87._8_4_ =
                   auVar111._8_4_ * fStack_ab8 +
                   auVar89._8_4_ * fStack_ad8 +
                   auVar84._8_4_ * fStack_ae8 + auVar83._8_4_ * fStack_ac8;
              auVar87._12_4_ =
                   auVar111._12_4_ * fStack_ab4 +
                   auVar89._12_4_ * fStack_ad4 +
                   auVar84._12_4_ * fStack_ae4 + auVar83._12_4_ * fStack_ac4;
              local_a40._0_16_ = auVar87;
              auVar84 = vsubps_avx(auVar137,auVar87);
              local_940 = auVar84._0_4_;
              fStack_93c = auVar84._4_4_;
              fStack_938 = auVar84._8_4_;
              fStack_934 = auVar84._12_4_;
              auVar84 = vdpps_avx(auVar84,auVar84,0x7f);
              fVar206 = auVar84._0_4_;
              if (fVar206 < 0.0) {
                fVar168 = sqrtf(fVar206);
              }
              else {
                auVar83 = vsqrtss_avx(auVar84,auVar84);
                fVar168 = auVar83._0_4_;
              }
              auVar83 = ZEXT416((uint)(fVar150 * fVar150 * 0.5));
              auVar83 = vshufps_avx(auVar83,auVar83,0);
              auVar89 = ZEXT416((uint)((fVar169 * fVar169 + fVar208 * 4.0) * 0.5));
              auVar89 = vshufps_avx(auVar89,auVar89,0);
              auVar111 = ZEXT416((uint)((fVar150 * -fVar150 - fVar208 * 4.0) * 0.5));
              auVar111 = vshufps_avx(auVar111,auVar111,0);
              auVar88 = ZEXT416((uint)(fVar169 * -fVar169 * 0.5));
              auVar88 = vshufps_avx(auVar88,auVar88,0);
              auVar268._0_4_ =
                   local_ac0 * auVar88._0_4_ +
                   local_ae0 * auVar111._0_4_ +
                   local_af0 * auVar83._0_4_ + local_ad0 * auVar89._0_4_;
              auVar268._4_4_ =
                   fStack_abc * auVar88._4_4_ +
                   fStack_adc * auVar111._4_4_ +
                   fStack_aec * auVar83._4_4_ + fStack_acc * auVar89._4_4_;
              auVar268._8_4_ =
                   fStack_ab8 * auVar88._8_4_ +
                   fStack_ad8 * auVar111._8_4_ +
                   fStack_ae8 * auVar83._8_4_ + fStack_ac8 * auVar89._8_4_;
              auVar268._12_4_ =
                   fStack_ab4 * auVar88._12_4_ +
                   fStack_ad4 * auVar111._12_4_ +
                   fStack_ae4 * auVar83._12_4_ + fStack_ac4 * auVar89._12_4_;
              auVar83 = vshufps_avx(auVar155,auVar155,0x55);
              auVar89 = ZEXT416((uint)(fVar169 - (fVar150 + fVar150)));
              auVar111 = vshufps_avx(auVar89,auVar89,0);
              auVar89 = ZEXT416((uint)(fVar150 - (fVar169 + fVar169)));
              auVar88 = vshufps_avx(auVar89,auVar89,0);
              auVar135 = vshufps_avx(ZEXT416((uint)fVar169),ZEXT416((uint)fVar169),0);
              auVar89 = vdpps_avx(auVar268,auVar268,0x7f);
              auVar112._0_4_ =
                   local_ac0 * auVar135._0_4_ +
                   local_ae0 * auVar88._0_4_ +
                   local_af0 * auVar83._0_4_ + local_ad0 * auVar111._0_4_;
              auVar112._4_4_ =
                   fStack_abc * auVar135._4_4_ +
                   fStack_adc * auVar88._4_4_ +
                   fStack_aec * auVar83._4_4_ + fStack_acc * auVar111._4_4_;
              auVar112._8_4_ =
                   fStack_ab8 * auVar135._8_4_ +
                   fStack_ad8 * auVar88._8_4_ +
                   fStack_ae8 * auVar83._8_4_ + fStack_ac8 * auVar111._8_4_;
              auVar112._12_4_ =
                   fStack_ab4 * auVar135._12_4_ +
                   fStack_ad4 * auVar88._12_4_ +
                   fStack_ae4 * auVar83._12_4_ + fStack_ac4 * auVar111._12_4_;
              auVar83 = vblendps_avx(auVar89,_DAT_01f45a50,0xe);
              auVar111 = vrsqrtss_avx(auVar83,auVar83);
              fVar208 = auVar111._0_4_;
              fVar150 = auVar89._0_4_;
              auVar111 = vdpps_avx(auVar268,auVar112,0x7f);
              auVar88 = vshufps_avx(auVar89,auVar89,0);
              auVar113._0_4_ = auVar112._0_4_ * auVar88._0_4_;
              auVar113._4_4_ = auVar112._4_4_ * auVar88._4_4_;
              auVar113._8_4_ = auVar112._8_4_ * auVar88._8_4_;
              auVar113._12_4_ = auVar112._12_4_ * auVar88._12_4_;
              auVar111 = vshufps_avx(auVar111,auVar111,0);
              auVar174._0_4_ = auVar268._0_4_ * auVar111._0_4_;
              auVar174._4_4_ = auVar268._4_4_ * auVar111._4_4_;
              auVar174._8_4_ = auVar268._8_4_ * auVar111._8_4_;
              auVar174._12_4_ = auVar268._12_4_ * auVar111._12_4_;
              auVar135 = vsubps_avx(auVar113,auVar174);
              auVar111 = vrcpss_avx(auVar83,auVar83);
              auVar83 = vmaxss_avx(ZEXT416((uint)local_a80._0_4_),
                                   ZEXT416((uint)(auVar205._0_4_ * (float)local_920._0_4_)));
              auVar314 = ZEXT1664(auVar83);
              auVar111 = ZEXT416((uint)(auVar111._0_4_ * (2.0 - fVar150 * auVar111._0_4_)));
              auVar111 = vshufps_avx(auVar111,auVar111,0);
              uVar77 = CONCAT44(auVar268._4_4_,auVar268._0_4_);
              auVar193._0_8_ = uVar77 ^ 0x8000000080000000;
              auVar193._8_4_ = -auVar268._8_4_;
              auVar193._12_4_ = -auVar268._12_4_;
              auVar88 = ZEXT416((uint)(fVar208 * 1.5 + fVar150 * -0.5 * fVar208 * fVar208 * fVar208)
                               );
              auVar88 = vshufps_avx(auVar88,auVar88,0);
              auVar153._0_4_ = auVar88._0_4_ * auVar135._0_4_ * auVar111._0_4_;
              auVar153._4_4_ = auVar88._4_4_ * auVar135._4_4_ * auVar111._4_4_;
              auVar153._8_4_ = auVar88._8_4_ * auVar135._8_4_ * auVar111._8_4_;
              auVar153._12_4_ = auVar88._12_4_ * auVar135._12_4_ * auVar111._12_4_;
              auVar219._0_4_ = auVar268._0_4_ * auVar88._0_4_;
              auVar219._4_4_ = auVar268._4_4_ * auVar88._4_4_;
              auVar219._8_4_ = auVar268._8_4_ * auVar88._8_4_;
              auVar219._12_4_ = auVar268._12_4_ * auVar88._12_4_;
              if (fVar150 < 0.0) {
                local_a20._0_16_ = auVar153;
                fVar150 = sqrtf(fVar150);
                auVar314 = ZEXT464(auVar83._0_4_);
                auVar153 = local_a20._0_16_;
              }
              else {
                auVar89 = vsqrtss_avx(auVar89,auVar89);
                fVar150 = auVar89._0_4_;
              }
              auVar69._4_4_ = fStack_93c;
              auVar69._0_4_ = local_940;
              auVar69._8_4_ = fStack_938;
              auVar69._12_4_ = fStack_934;
              auVar89 = vdpps_avx(auVar69,auVar219,0x7f);
              fVar150 = ((float)local_a80._0_4_ / fVar150) * (fVar168 + 1.0) +
                        auVar314._0_4_ + fVar168 * (float)local_a80._0_4_;
              auVar111 = vdpps_avx(auVar193,auVar219,0x7f);
              auVar88 = vdpps_avx(auVar69,auVar153,0x7f);
              auVar135 = vdpps_avx(_local_9f0,auVar219,0x7f);
              auVar136 = vdpps_avx(auVar69,auVar193,0x7f);
              fVar168 = auVar111._0_4_ + auVar88._0_4_;
              fVar208 = auVar89._0_4_;
              auVar90._0_4_ = fVar208 * fVar208;
              auVar90._4_4_ = auVar89._4_4_ * auVar89._4_4_;
              auVar90._8_4_ = auVar89._8_4_ * auVar89._8_4_;
              auVar90._12_4_ = auVar89._12_4_ * auVar89._12_4_;
              auVar88 = vsubps_avx(auVar84,auVar90);
              auVar111 = vdpps_avx(auVar69,_local_9f0,0x7f);
              fVar169 = auVar136._0_4_ - fVar208 * fVar168;
              fVar210 = auVar111._0_4_ - fVar208 * auVar135._0_4_;
              auVar111 = vrsqrtss_avx(auVar88,auVar88);
              fVar170 = auVar88._0_4_;
              fVar208 = auVar111._0_4_;
              fVar208 = fVar208 * 1.5 + fVar170 * -0.5 * fVar208 * fVar208 * fVar208;
              if (fVar170 < 0.0) {
                local_a20._0_16_ = ZEXT416((uint)fVar168);
                local_800._0_4_ = fVar169;
                local_820._0_4_ = fVar210;
                local_960._0_4_ = fVar208;
                fVar170 = sqrtf(fVar170);
                auVar314 = ZEXT464(auVar83._0_4_);
                fVar208 = (float)local_960._0_4_;
                fVar169 = (float)local_800._0_4_;
                fVar210 = (float)local_820._0_4_;
                auVar83 = local_a20._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar88,auVar88);
                fVar170 = auVar83._0_4_;
                auVar83 = ZEXT416((uint)fVar168);
              }
              auVar341 = ZEXT1664(auVar89);
              auVar326 = ZEXT464((uint)fVar150);
              auVar256 = ZEXT1664(auVar84);
              auVar91 = vpermilps_avx(local_a40._0_16_,0xff);
              auVar136 = vshufps_avx(auVar268,auVar268,0xff);
              fVar168 = fVar169 * fVar208 - auVar136._0_4_;
              auVar175._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
              auVar175._8_4_ = auVar135._8_4_ ^ 0x80000000;
              auVar175._12_4_ = auVar135._12_4_ ^ 0x80000000;
              auVar194._0_4_ = -fVar168;
              auVar194._4_4_ = 0x80000000;
              auVar194._8_4_ = 0x80000000;
              auVar194._12_4_ = 0x80000000;
              auVar111 = vinsertps_avx(auVar194,ZEXT416((uint)(fVar210 * fVar208)),0x1c);
              auVar88 = vmovsldup_avx(ZEXT416((uint)(auVar83._0_4_ * fVar210 * fVar208 -
                                                    auVar135._0_4_ * fVar168)));
              auVar111 = vdivps_avx(auVar111,auVar88);
              auVar83 = vinsertps_avx(auVar83,auVar175,0x10);
              auVar83 = vdivps_avx(auVar83,auVar88);
              auVar88 = vmovsldup_avx(auVar89);
              auVar91 = ZEXT416((uint)(fVar170 - auVar91._0_4_));
              auVar135 = vmovsldup_avx(auVar91);
              auVar138._0_4_ = auVar88._0_4_ * auVar111._0_4_ + auVar135._0_4_ * auVar83._0_4_;
              auVar138._4_4_ = auVar88._4_4_ * auVar111._4_4_ + auVar135._4_4_ * auVar83._4_4_;
              auVar138._8_4_ = auVar88._8_4_ * auVar111._8_4_ + auVar135._8_4_ * auVar83._8_4_;
              auVar138._12_4_ = auVar88._12_4_ * auVar111._12_4_ + auVar135._12_4_ * auVar83._12_4_;
              auVar83 = vsubps_avx(auVar155,auVar138);
              auVar205 = ZEXT1664(auVar83);
              auVar139._8_4_ = 0x7fffffff;
              auVar139._0_8_ = 0x7fffffff7fffffff;
              auVar139._12_4_ = 0x7fffffff;
              auVar155 = vandps_avx(auVar89,auVar139);
            } while (fVar150 <= auVar155._0_4_);
            auVar154._8_4_ = 0x7fffffff;
            auVar154._0_8_ = 0x7fffffff7fffffff;
            auVar154._12_4_ = 0x7fffffff;
            auVar155 = vandps_avx(auVar91,auVar154);
          } while ((float)local_980._0_4_ * 1.9073486e-06 + auVar314._0_4_ + fVar150 <=
                   auVar155._0_4_);
          fVar168 = auVar83._0_4_ + (float)local_8f0._0_4_;
          if ((fVar189 <= fVar168) && (fVar208 = *(float *)(ray + k * 4 + 0x80), fVar168 <= fVar208)
             ) {
            auVar155 = vmovshdup_avx(auVar83);
            fVar169 = auVar155._0_4_;
            if ((0.0 <= fVar169) && (fVar169 <= 1.0)) {
              auVar155 = vrsqrtss_avx(auVar84,auVar84);
              fVar210 = auVar155._0_4_;
              pGVar3 = (context->scene->geometries).items[uVar74].ptr;
              if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                auVar155 = ZEXT416((uint)(fVar210 * 1.5 +
                                         fVar206 * -0.5 * fVar210 * fVar210 * fVar210));
                auVar155 = vshufps_avx(auVar155,auVar155,0);
                auVar156._0_4_ = auVar155._0_4_ * local_940;
                auVar156._4_4_ = auVar155._4_4_ * fStack_93c;
                auVar156._8_4_ = auVar155._8_4_ * fStack_938;
                auVar156._12_4_ = auVar155._12_4_ * fStack_934;
                auVar114._0_4_ = auVar268._0_4_ + auVar136._0_4_ * auVar156._0_4_;
                auVar114._4_4_ = auVar268._4_4_ + auVar136._4_4_ * auVar156._4_4_;
                auVar114._8_4_ = auVar268._8_4_ + auVar136._8_4_ * auVar156._8_4_;
                auVar114._12_4_ = auVar268._12_4_ + auVar136._12_4_ * auVar156._12_4_;
                auVar155 = vshufps_avx(auVar156,auVar156,0xc9);
                auVar111 = vshufps_avx(auVar268,auVar268,0xc9);
                auVar157._0_4_ = auVar111._0_4_ * auVar156._0_4_;
                auVar157._4_4_ = auVar111._4_4_ * auVar156._4_4_;
                auVar157._8_4_ = auVar111._8_4_ * auVar156._8_4_;
                auVar157._12_4_ = auVar111._12_4_ * auVar156._12_4_;
                auVar176._0_4_ = auVar268._0_4_ * auVar155._0_4_;
                auVar176._4_4_ = auVar268._4_4_ * auVar155._4_4_;
                auVar176._8_4_ = auVar268._8_4_ * auVar155._8_4_;
                auVar176._12_4_ = auVar268._12_4_ * auVar155._12_4_;
                auVar88 = vsubps_avx(auVar176,auVar157);
                auVar155 = vshufps_avx(auVar88,auVar88,0xc9);
                auVar111 = vshufps_avx(auVar114,auVar114,0xc9);
                auVar177._0_4_ = auVar111._0_4_ * auVar155._0_4_;
                auVar177._4_4_ = auVar111._4_4_ * auVar155._4_4_;
                auVar177._8_4_ = auVar111._8_4_ * auVar155._8_4_;
                auVar177._12_4_ = auVar111._12_4_ * auVar155._12_4_;
                auVar155 = vshufps_avx(auVar88,auVar88,0xd2);
                auVar115._0_4_ = auVar114._0_4_ * auVar155._0_4_;
                auVar115._4_4_ = auVar114._4_4_ * auVar155._4_4_;
                auVar115._8_4_ = auVar114._8_4_ * auVar155._8_4_;
                auVar115._12_4_ = auVar114._12_4_ * auVar155._12_4_;
                auVar155 = vsubps_avx(auVar177,auVar115);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar168;
                  uVar1 = vextractps_avx(auVar155,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                  uVar1 = vextractps_avx(auVar155,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                  *(int *)(ray + k * 4 + 0xe0) = auVar155._0_4_;
                  *(float *)(ray + k * 4 + 0xf0) = fVar169;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                  *(uint *)(ray + k * 4 + 0x120) = uVar74;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_790 = vshufps_avx(auVar83,auVar83,0x55);
                  auVar83 = vshufps_avx(auVar155,auVar155,0x55);
                  auStack_7b0 = vshufps_avx(auVar155,auVar155,0xaa);
                  local_7a0 = vshufps_avx(auVar155,auVar155,0);
                  local_7c0 = (RTCHitN  [16])auVar83;
                  local_780 = ZEXT816(0) << 0x20;
                  local_770 = local_7e0._0_8_;
                  uStack_768 = local_7e0._8_8_;
                  local_760 = local_7d0;
                  vcmpps_avx(ZEXT1632(local_7d0),ZEXT1632(local_7d0),0xf);
                  uStack_74c = context->user->instID[0];
                  local_750 = uStack_74c;
                  uStack_748 = uStack_74c;
                  uStack_744 = uStack_74c;
                  uVar80 = context->user->instPrimID[0];
                  auVar116._4_4_ = uVar80;
                  auVar116._0_4_ = uVar80;
                  auVar116._8_4_ = uVar80;
                  auVar116._12_4_ = uVar80;
                  auStack_740 = auVar116;
                  *(float *)(ray + k * 4 + 0x80) = fVar168;
                  local_860._0_16_ = *local_a48;
                  local_ab0.valid = (int *)local_860;
                  local_ab0.geometryUserPtr = pGVar3->userPtr;
                  local_ab0.context = context->user;
                  local_ab0.hit = local_7c0;
                  local_ab0.N = 4;
                  auVar155 = *local_a48;
                  local_ab0.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar256 = ZEXT1664(auVar84);
                    auVar314 = ZEXT1664(auVar314._0_16_);
                    auVar326 = ZEXT464((uint)fVar150);
                    auVar341 = ZEXT1664(auVar89);
                    (*pGVar3->intersectionFilterN)(&local_ab0);
                    auVar224._8_56_ = extraout_var;
                    auVar224._0_8_ = extraout_XMM1_Qa;
                    auVar116 = auVar224._0_16_;
                    auVar155 = local_860._0_16_;
                  }
                  if (auVar155 == (undefined1  [16])0x0) {
                    auVar84 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar155 = vpcmpeqd_avx(auVar116,auVar116);
                    auVar84 = auVar84 ^ auVar155;
                  }
                  else {
                    p_Var4 = context->args->filter;
                    auVar83 = vpcmpeqd_avx(auVar83,auVar83);
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar256 = ZEXT1664(auVar256._0_16_);
                      auVar314 = ZEXT1664(auVar314._0_16_);
                      auVar326 = ZEXT1664(auVar326._0_16_);
                      auVar341 = ZEXT1664(auVar341._0_16_);
                      (*p_Var4)(&local_ab0);
                      auVar83 = vpcmpeqd_avx(auVar83,auVar83);
                      auVar155 = local_860._0_16_;
                    }
                    auVar89 = vpcmpeqd_avx(auVar155,_DAT_01f45a50);
                    auVar84 = auVar89 ^ auVar83;
                    if (auVar155 != (undefined1  [16])0x0) {
                      auVar89 = auVar89 ^ auVar83;
                      auVar155 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])local_ab0.hit);
                      *(undefined1 (*) [16])(local_ab0.ray + 0xc0) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])(local_ab0.hit + 0x10)
                                               );
                      *(undefined1 (*) [16])(local_ab0.ray + 0xd0) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])(local_ab0.hit + 0x20)
                                               );
                      *(undefined1 (*) [16])(local_ab0.ray + 0xe0) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])(local_ab0.hit + 0x30)
                                               );
                      *(undefined1 (*) [16])(local_ab0.ray + 0xf0) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])(local_ab0.hit + 0x40)
                                               );
                      *(undefined1 (*) [16])(local_ab0.ray + 0x100) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])(local_ab0.hit + 0x50)
                                               );
                      *(undefined1 (*) [16])(local_ab0.ray + 0x110) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])(local_ab0.hit + 0x60)
                                               );
                      *(undefined1 (*) [16])(local_ab0.ray + 0x120) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])(local_ab0.hit + 0x70)
                                               );
                      *(undefined1 (*) [16])(local_ab0.ray + 0x130) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar89,*(undefined1 (*) [16])(local_ab0.hit + 0x80)
                                               );
                      *(undefined1 (*) [16])(local_ab0.ray + 0x140) = auVar155;
                    }
                  }
                  auVar92._8_8_ = 0x100000001;
                  auVar92._0_8_ = 0x100000001;
                  if ((auVar92 & auVar84) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar208;
                  }
                }
              }
            }
          }
LAB_00856d97:
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar308._4_4_ = uVar1;
          auVar308._0_4_ = uVar1;
          auVar308._8_4_ = uVar1;
          auVar308._12_4_ = uVar1;
          auVar308._16_4_ = uVar1;
          auVar308._20_4_ = uVar1;
          auVar308._24_4_ = uVar1;
          auVar308._28_4_ = uVar1;
          auVar310 = ZEXT3264(auVar308);
          auVar122 = vcmpps_avx(_local_9e0,auVar308,2);
          auVar122 = vandps_avx(auVar122,local_420);
        }
        auVar105._0_4_ = (float)local_880._0_4_ + (float)local_9c0._0_4_;
        auVar105._4_4_ = (float)local_880._4_4_ + (float)local_9c0._4_4_;
        auVar105._8_4_ = fStack_878 + fStack_9b8;
        auVar105._12_4_ = fStack_874 + fStack_9b4;
        auVar105._16_4_ = fStack_870 + fStack_9b0;
        auVar105._20_4_ = fStack_86c + fStack_9ac;
        auVar105._24_4_ = fStack_868 + fStack_9a8;
        auVar105._28_4_ = fStack_864 + fStack_9a4;
        auVar155 = vshufps_avx(auVar310._0_16_,auVar310._0_16_,0);
        auVar131._16_16_ = auVar155;
        auVar131._0_16_ = auVar155;
        auVar122 = vcmpps_avx(auVar105,auVar131,2);
        _local_9e0 = vandps_avx(auVar122,local_840);
        auVar106._8_4_ = 3;
        auVar106._0_8_ = 0x300000003;
        auVar106._12_4_ = 3;
        auVar106._16_4_ = 3;
        auVar106._20_4_ = 3;
        auVar106._24_4_ = 3;
        auVar106._28_4_ = 3;
        auVar132._8_4_ = 2;
        auVar132._0_8_ = 0x200000002;
        auVar132._12_4_ = 2;
        auVar132._16_4_ = 2;
        auVar132._20_4_ = 2;
        auVar132._24_4_ = 2;
        auVar132._28_4_ = 2;
        auVar122 = vblendvps_avx(auVar132,auVar106,local_6a0);
        auVar155 = vpcmpgtd_avx(auVar122._16_16_,_local_6e0);
        auVar84 = vpshufd_avx(local_6c0._0_16_,0);
        auVar84 = vpcmpgtd_avx(auVar122._0_16_,auVar84);
        auVar133._16_16_ = auVar155;
        auVar133._0_16_ = auVar84;
        local_840 = vblendps_avx(ZEXT1632(auVar84),auVar133,0xf0);
        local_860 = vandnps_avx(local_840,_local_9e0);
        local_9a0 = _local_3c0;
        local_9c0._4_4_ = (float)local_880._4_4_ + (float)local_3c0._4_4_;
        local_9c0._0_4_ = (float)local_880._0_4_ + (float)local_3c0._0_4_;
        fStack_9b8 = fStack_878 + fStack_3b8;
        fStack_9b4 = fStack_874 + fStack_3b4;
        fStack_9b0 = fStack_870 + fStack_3b0;
        fStack_9ac = fStack_86c + fStack_3ac;
        fStack_9a8 = fStack_868 + fStack_3a8;
        fStack_9a4 = fStack_864 + fStack_3a4;
        fVar150 = (float)local_880._0_4_;
        fVar206 = (float)local_880._4_4_;
        fVar168 = fStack_878;
        fVar208 = fStack_874;
        fVar169 = fStack_870;
        fVar210 = fStack_86c;
        fVar170 = fStack_868;
        fVar216 = fStack_864;
        while ((((((((local_860 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    (local_860 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_860 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(local_860 >> 0x7f,0) != '\0') ||
                 (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                SUB321(local_860 >> 0xbf,0) != '\0') ||
               (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               local_860[0x1f] < '\0') {
          auVar134._8_4_ = 0x7f800000;
          auVar134._0_8_ = 0x7f8000007f800000;
          auVar134._12_4_ = 0x7f800000;
          auVar134._16_4_ = 0x7f800000;
          auVar134._20_4_ = 0x7f800000;
          auVar134._24_4_ = 0x7f800000;
          auVar134._28_4_ = 0x7f800000;
          auVar122 = vblendvps_avx(auVar134,local_9a0,local_860);
          auVar97 = vshufps_avx(auVar122,auVar122,0xb1);
          auVar97 = vminps_avx(auVar122,auVar97);
          auVar17 = vshufpd_avx(auVar97,auVar97,5);
          auVar97 = vminps_avx(auVar97,auVar17);
          auVar17 = vperm2f128_avx(auVar97,auVar97,1);
          auVar97 = vminps_avx(auVar97,auVar17);
          auVar97 = vcmpps_avx(auVar122,auVar97,0);
          auVar17 = local_860 & auVar97;
          auVar122 = local_860;
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0x7f,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0xbf,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar17[0x1f] < '\0') {
            auVar122 = vandps_avx(auVar97,local_860);
          }
          uVar75 = vmovmskps_avx(auVar122);
          uVar80 = 0;
          if (uVar75 != 0) {
            for (; (uVar75 >> uVar80 & 1) == 0; uVar80 = uVar80 + 1) {
            }
          }
          uVar77 = (ulong)uVar80;
          *(undefined4 *)(local_860 + uVar77 * 4) = 0;
          fVar150 = local_1c0[uVar77];
          uVar80 = *(uint *)(local_3a0 + uVar77 * 4);
          fVar206 = auVar8._0_4_;
          if ((float)local_a00._0_4_ < 0.0) {
            auVar314 = ZEXT1664(auVar314._0_16_);
            auVar326 = ZEXT1664(auVar326._0_16_);
            auVar341 = ZEXT1664(auVar341._0_16_);
            fVar206 = sqrtf((float)local_a00._0_4_);
          }
          auVar256 = ZEXT464(uVar80);
          auVar224 = ZEXT464((uint)fVar150);
          auVar84 = vminps_avx(auVar10,auVar108);
          auVar155 = vmaxps_avx(auVar10,auVar108);
          auVar83 = vminps_avx(auVar85,auVar9);
          auVar89 = vminps_avx(auVar84,auVar83);
          auVar84 = vmaxps_avx(auVar85,auVar9);
          auVar83 = vmaxps_avx(auVar155,auVar84);
          auVar158._8_4_ = 0x7fffffff;
          auVar158._0_8_ = 0x7fffffff7fffffff;
          auVar158._12_4_ = 0x7fffffff;
          auVar155 = vandps_avx(auVar89,auVar158);
          auVar84 = vandps_avx(auVar83,auVar158);
          auVar155 = vmaxps_avx(auVar155,auVar84);
          auVar84 = vmovshdup_avx(auVar155);
          auVar84 = vmaxss_avx(auVar84,auVar155);
          auVar155 = vshufpd_avx(auVar155,auVar155,1);
          auVar155 = vmaxss_avx(auVar155,auVar84);
          local_a80._0_4_ = auVar155._0_4_ * 1.9073486e-06;
          local_920._0_4_ = fVar206 * 1.9073486e-06;
          local_980._0_16_ = vshufps_avx(auVar83,auVar83,0xff);
          auVar155 = vinsertps_avx(ZEXT416(uVar80),ZEXT416((uint)fVar150),0x10);
          auVar205 = ZEXT1664(auVar155);
          lVar76 = 5;
          do {
            do {
              auVar155 = auVar205._0_16_;
              bVar82 = lVar76 == 0;
              lVar76 = lVar76 + -1;
              if (bVar82) goto LAB_00857965;
              auVar84 = vmovshdup_avx(auVar155);
              fVar150 = auVar84._0_4_;
              fVar169 = 1.0 - fVar150;
              fVar206 = fVar169 * fVar169 * fVar169;
              fVar168 = fVar150 * fVar150 * fVar150;
              fVar208 = fVar150 * fVar169;
              auVar84 = vshufps_avx(ZEXT416((uint)(fVar168 * 0.16666667)),
                                    ZEXT416((uint)(fVar168 * 0.16666667)),0);
              auVar83 = ZEXT416((uint)((fVar168 * 4.0 + fVar206 +
                                       fVar150 * fVar208 * 12.0 + fVar169 * fVar208 * 6.0) *
                                      0.16666667));
              auVar83 = vshufps_avx(auVar83,auVar83,0);
              auVar89 = ZEXT416((uint)((fVar206 * 4.0 + fVar168 +
                                       fVar169 * fVar208 * 12.0 + fVar150 * fVar208 * 6.0) *
                                      0.16666667));
              auVar89 = vshufps_avx(auVar89,auVar89,0);
              auVar111 = vshufps_avx(auVar155,auVar155,0);
              auVar140._0_4_ = auVar111._0_4_ * (float)local_9f0._0_4_ + 0.0;
              auVar140._4_4_ = auVar111._4_4_ * (float)local_9f0._4_4_ + 0.0;
              auVar140._8_4_ = auVar111._8_4_ * fStack_9e8 + 0.0;
              auVar140._12_4_ = auVar111._12_4_ * fStack_9e4 + 0.0;
              auVar111 = vshufps_avx(ZEXT416((uint)(fVar206 * 0.16666667)),
                                     ZEXT416((uint)(fVar206 * 0.16666667)),0);
              auVar93._0_4_ =
                   auVar111._0_4_ * local_ac0 +
                   auVar89._0_4_ * local_ae0 + auVar84._0_4_ * local_af0 + auVar83._0_4_ * local_ad0
              ;
              auVar93._4_4_ =
                   auVar111._4_4_ * fStack_abc +
                   auVar89._4_4_ * fStack_adc +
                   auVar84._4_4_ * fStack_aec + auVar83._4_4_ * fStack_acc;
              auVar93._8_4_ =
                   auVar111._8_4_ * fStack_ab8 +
                   auVar89._8_4_ * fStack_ad8 +
                   auVar84._8_4_ * fStack_ae8 + auVar83._8_4_ * fStack_ac8;
              auVar93._12_4_ =
                   auVar111._12_4_ * fStack_ab4 +
                   auVar89._12_4_ * fStack_ad4 +
                   auVar84._12_4_ * fStack_ae4 + auVar83._12_4_ * fStack_ac4;
              local_a40._0_16_ = auVar93;
              auVar84 = vsubps_avx(auVar140,auVar93);
              local_940 = auVar84._0_4_;
              fStack_93c = auVar84._4_4_;
              fStack_938 = auVar84._8_4_;
              fStack_934 = auVar84._12_4_;
              auVar84 = vdpps_avx(auVar84,auVar84,0x7f);
              fVar206 = auVar84._0_4_;
              if (fVar206 < 0.0) {
                fVar168 = sqrtf(fVar206);
              }
              else {
                auVar83 = vsqrtss_avx(auVar84,auVar84);
                fVar168 = auVar83._0_4_;
              }
              auVar83 = ZEXT416((uint)(fVar150 * fVar150 * 0.5));
              auVar83 = vshufps_avx(auVar83,auVar83,0);
              auVar89 = ZEXT416((uint)((fVar169 * fVar169 + fVar208 * 4.0) * 0.5));
              auVar89 = vshufps_avx(auVar89,auVar89,0);
              auVar111 = ZEXT416((uint)((fVar150 * -fVar150 - fVar208 * 4.0) * 0.5));
              auVar111 = vshufps_avx(auVar111,auVar111,0);
              auVar88 = ZEXT416((uint)(fVar169 * -fVar169 * 0.5));
              auVar88 = vshufps_avx(auVar88,auVar88,0);
              auVar269._0_4_ =
                   local_ac0 * auVar88._0_4_ +
                   local_ae0 * auVar111._0_4_ +
                   local_af0 * auVar83._0_4_ + local_ad0 * auVar89._0_4_;
              auVar269._4_4_ =
                   fStack_abc * auVar88._4_4_ +
                   fStack_adc * auVar111._4_4_ +
                   fStack_aec * auVar83._4_4_ + fStack_acc * auVar89._4_4_;
              auVar269._8_4_ =
                   fStack_ab8 * auVar88._8_4_ +
                   fStack_ad8 * auVar111._8_4_ +
                   fStack_ae8 * auVar83._8_4_ + fStack_ac8 * auVar89._8_4_;
              auVar269._12_4_ =
                   fStack_ab4 * auVar88._12_4_ +
                   fStack_ad4 * auVar111._12_4_ +
                   fStack_ae4 * auVar83._12_4_ + fStack_ac4 * auVar89._12_4_;
              auVar83 = vshufps_avx(auVar155,auVar155,0x55);
              auVar89 = ZEXT416((uint)(fVar169 - (fVar150 + fVar150)));
              auVar111 = vshufps_avx(auVar89,auVar89,0);
              auVar89 = ZEXT416((uint)(fVar150 - (fVar169 + fVar169)));
              auVar88 = vshufps_avx(auVar89,auVar89,0);
              auVar135 = vshufps_avx(ZEXT416((uint)fVar169),ZEXT416((uint)fVar169),0);
              auVar89 = vdpps_avx(auVar269,auVar269,0x7f);
              auVar117._0_4_ =
                   local_ac0 * auVar135._0_4_ +
                   local_ae0 * auVar88._0_4_ +
                   local_af0 * auVar83._0_4_ + local_ad0 * auVar111._0_4_;
              auVar117._4_4_ =
                   fStack_abc * auVar135._4_4_ +
                   fStack_adc * auVar88._4_4_ +
                   fStack_aec * auVar83._4_4_ + fStack_acc * auVar111._4_4_;
              auVar117._8_4_ =
                   fStack_ab8 * auVar135._8_4_ +
                   fStack_ad8 * auVar88._8_4_ +
                   fStack_ae8 * auVar83._8_4_ + fStack_ac8 * auVar111._8_4_;
              auVar117._12_4_ =
                   fStack_ab4 * auVar135._12_4_ +
                   fStack_ad4 * auVar88._12_4_ +
                   fStack_ae4 * auVar83._12_4_ + fStack_ac4 * auVar111._12_4_;
              auVar83 = vblendps_avx(auVar89,_DAT_01f45a50,0xe);
              auVar111 = vrsqrtss_avx(auVar83,auVar83);
              fVar208 = auVar111._0_4_;
              fVar150 = auVar89._0_4_;
              auVar111 = vdpps_avx(auVar269,auVar117,0x7f);
              auVar88 = vshufps_avx(auVar89,auVar89,0);
              auVar118._0_4_ = auVar117._0_4_ * auVar88._0_4_;
              auVar118._4_4_ = auVar117._4_4_ * auVar88._4_4_;
              auVar118._8_4_ = auVar117._8_4_ * auVar88._8_4_;
              auVar118._12_4_ = auVar117._12_4_ * auVar88._12_4_;
              auVar111 = vshufps_avx(auVar111,auVar111,0);
              auVar178._0_4_ = auVar269._0_4_ * auVar111._0_4_;
              auVar178._4_4_ = auVar269._4_4_ * auVar111._4_4_;
              auVar178._8_4_ = auVar269._8_4_ * auVar111._8_4_;
              auVar178._12_4_ = auVar269._12_4_ * auVar111._12_4_;
              auVar135 = vsubps_avx(auVar118,auVar178);
              auVar111 = vrcpss_avx(auVar83,auVar83);
              auVar83 = vmaxss_avx(ZEXT416((uint)local_a80._0_4_),
                                   ZEXT416((uint)(auVar205._0_4_ * (float)local_920._0_4_)));
              auVar314 = ZEXT1664(auVar83);
              auVar111 = ZEXT416((uint)(auVar111._0_4_ * (2.0 - fVar150 * auVar111._0_4_)));
              auVar111 = vshufps_avx(auVar111,auVar111,0);
              uVar77 = CONCAT44(auVar269._4_4_,auVar269._0_4_);
              auVar195._0_8_ = uVar77 ^ 0x8000000080000000;
              auVar195._8_4_ = -auVar269._8_4_;
              auVar195._12_4_ = -auVar269._12_4_;
              auVar88 = ZEXT416((uint)(fVar208 * 1.5 + fVar150 * -0.5 * fVar208 * fVar208 * fVar208)
                               );
              auVar88 = vshufps_avx(auVar88,auVar88,0);
              auVar159._0_4_ = auVar88._0_4_ * auVar135._0_4_ * auVar111._0_4_;
              auVar159._4_4_ = auVar88._4_4_ * auVar135._4_4_ * auVar111._4_4_;
              auVar159._8_4_ = auVar88._8_4_ * auVar135._8_4_ * auVar111._8_4_;
              auVar159._12_4_ = auVar88._12_4_ * auVar135._12_4_ * auVar111._12_4_;
              auVar220._0_4_ = auVar269._0_4_ * auVar88._0_4_;
              auVar220._4_4_ = auVar269._4_4_ * auVar88._4_4_;
              auVar220._8_4_ = auVar269._8_4_ * auVar88._8_4_;
              auVar220._12_4_ = auVar269._12_4_ * auVar88._12_4_;
              if (fVar150 < 0.0) {
                local_a20._0_16_ = auVar159;
                fVar150 = sqrtf(fVar150);
                auVar314 = ZEXT464(auVar83._0_4_);
                auVar159 = local_a20._0_16_;
              }
              else {
                auVar89 = vsqrtss_avx(auVar89,auVar89);
                fVar150 = auVar89._0_4_;
              }
              auVar70._4_4_ = fStack_93c;
              auVar70._0_4_ = local_940;
              auVar70._8_4_ = fStack_938;
              auVar70._12_4_ = fStack_934;
              auVar89 = vdpps_avx(auVar70,auVar220,0x7f);
              fVar150 = ((float)local_a80._0_4_ / fVar150) * (fVar168 + 1.0) +
                        auVar314._0_4_ + fVar168 * (float)local_a80._0_4_;
              auVar111 = vdpps_avx(auVar195,auVar220,0x7f);
              auVar88 = vdpps_avx(auVar70,auVar159,0x7f);
              auVar135 = vdpps_avx(_local_9f0,auVar220,0x7f);
              auVar136 = vdpps_avx(auVar70,auVar195,0x7f);
              fVar168 = auVar111._0_4_ + auVar88._0_4_;
              fVar208 = auVar89._0_4_;
              auVar94._0_4_ = fVar208 * fVar208;
              auVar94._4_4_ = auVar89._4_4_ * auVar89._4_4_;
              auVar94._8_4_ = auVar89._8_4_ * auVar89._8_4_;
              auVar94._12_4_ = auVar89._12_4_ * auVar89._12_4_;
              auVar88 = vsubps_avx(auVar84,auVar94);
              auVar111 = vdpps_avx(auVar70,_local_9f0,0x7f);
              fVar169 = auVar136._0_4_ - fVar208 * fVar168;
              fVar210 = auVar111._0_4_ - fVar208 * auVar135._0_4_;
              auVar111 = vrsqrtss_avx(auVar88,auVar88);
              fVar170 = auVar88._0_4_;
              fVar208 = auVar111._0_4_;
              fVar208 = fVar208 * 1.5 + fVar170 * -0.5 * fVar208 * fVar208 * fVar208;
              if (fVar170 < 0.0) {
                local_a20._0_16_ = ZEXT416((uint)fVar168);
                local_800._0_4_ = fVar169;
                local_820._0_4_ = fVar210;
                local_960._0_4_ = fVar208;
                fVar170 = sqrtf(fVar170);
                auVar314 = ZEXT464(auVar83._0_4_);
                fVar208 = (float)local_960._0_4_;
                fVar169 = (float)local_800._0_4_;
                fVar210 = (float)local_820._0_4_;
                auVar83 = local_a20._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar88,auVar88);
                fVar170 = auVar83._0_4_;
                auVar83 = ZEXT416((uint)fVar168);
              }
              auVar341 = ZEXT1664(auVar89);
              auVar326 = ZEXT464((uint)fVar150);
              auVar256 = ZEXT1664(auVar84);
              auVar91 = vpermilps_avx(local_a40._0_16_,0xff);
              auVar136 = vshufps_avx(auVar269,auVar269,0xff);
              fVar169 = fVar169 * fVar208 - auVar136._0_4_;
              auVar179._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
              auVar179._8_4_ = auVar135._8_4_ ^ 0x80000000;
              auVar179._12_4_ = auVar135._12_4_ ^ 0x80000000;
              auVar196._0_4_ = -fVar169;
              auVar196._4_4_ = 0x80000000;
              auVar196._8_4_ = 0x80000000;
              auVar196._12_4_ = 0x80000000;
              fVar168 = auVar83._0_4_ * fVar210 * fVar208;
              auVar224 = ZEXT464((uint)fVar168);
              auVar111 = vinsertps_avx(auVar196,ZEXT416((uint)(fVar210 * fVar208)),0x1c);
              auVar88 = vmovsldup_avx(ZEXT416((uint)(fVar168 - auVar135._0_4_ * fVar169)));
              auVar111 = vdivps_avx(auVar111,auVar88);
              auVar83 = vinsertps_avx(auVar83,auVar179,0x10);
              auVar83 = vdivps_avx(auVar83,auVar88);
              auVar88 = vmovsldup_avx(auVar89);
              auVar91 = ZEXT416((uint)(fVar170 - auVar91._0_4_));
              auVar135 = vmovsldup_avx(auVar91);
              auVar141._0_4_ = auVar88._0_4_ * auVar111._0_4_ + auVar135._0_4_ * auVar83._0_4_;
              auVar141._4_4_ = auVar88._4_4_ * auVar111._4_4_ + auVar135._4_4_ * auVar83._4_4_;
              auVar141._8_4_ = auVar88._8_4_ * auVar111._8_4_ + auVar135._8_4_ * auVar83._8_4_;
              auVar141._12_4_ = auVar88._12_4_ * auVar111._12_4_ + auVar135._12_4_ * auVar83._12_4_;
              auVar83 = vsubps_avx(auVar155,auVar141);
              auVar205 = ZEXT1664(auVar83);
              auVar142._8_4_ = 0x7fffffff;
              auVar142._0_8_ = 0x7fffffff7fffffff;
              auVar142._12_4_ = 0x7fffffff;
              auVar155 = vandps_avx(auVar89,auVar142);
            } while (fVar150 <= auVar155._0_4_);
            auVar160._8_4_ = 0x7fffffff;
            auVar160._0_8_ = 0x7fffffff7fffffff;
            auVar160._12_4_ = 0x7fffffff;
            auVar155 = vandps_avx(auVar91,auVar160);
          } while ((float)local_980._0_4_ * 1.9073486e-06 + auVar314._0_4_ + fVar150 <=
                   auVar155._0_4_);
          fVar168 = auVar83._0_4_ + (float)local_8f0._0_4_;
          if (fVar189 <= fVar168) {
            fVar208 = *(float *)(ray + k * 4 + 0x80);
            auVar224 = ZEXT464((uint)fVar208);
            if (fVar168 <= fVar208) {
              auVar155 = vmovshdup_avx(auVar83);
              fVar169 = auVar155._0_4_;
              if ((0.0 <= fVar169) && (fVar169 <= 1.0)) {
                auVar155 = vrsqrtss_avx(auVar84,auVar84);
                fVar210 = auVar155._0_4_;
                pGVar3 = (context->scene->geometries).items[uVar74].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar155 = ZEXT416((uint)(fVar210 * 1.5 +
                                           fVar206 * -0.5 * fVar210 * fVar210 * fVar210));
                  auVar155 = vshufps_avx(auVar155,auVar155,0);
                  auVar161._0_4_ = auVar155._0_4_ * local_940;
                  auVar161._4_4_ = auVar155._4_4_ * fStack_93c;
                  auVar161._8_4_ = auVar155._8_4_ * fStack_938;
                  auVar161._12_4_ = auVar155._12_4_ * fStack_934;
                  auVar119._0_4_ = auVar269._0_4_ + auVar136._0_4_ * auVar161._0_4_;
                  auVar119._4_4_ = auVar269._4_4_ + auVar136._4_4_ * auVar161._4_4_;
                  auVar119._8_4_ = auVar269._8_4_ + auVar136._8_4_ * auVar161._8_4_;
                  auVar119._12_4_ = auVar269._12_4_ + auVar136._12_4_ * auVar161._12_4_;
                  auVar155 = vshufps_avx(auVar161,auVar161,0xc9);
                  auVar111 = vshufps_avx(auVar269,auVar269,0xc9);
                  auVar162._0_4_ = auVar111._0_4_ * auVar161._0_4_;
                  auVar162._4_4_ = auVar111._4_4_ * auVar161._4_4_;
                  auVar162._8_4_ = auVar111._8_4_ * auVar161._8_4_;
                  auVar162._12_4_ = auVar111._12_4_ * auVar161._12_4_;
                  auVar180._0_4_ = auVar269._0_4_ * auVar155._0_4_;
                  auVar180._4_4_ = auVar269._4_4_ * auVar155._4_4_;
                  auVar180._8_4_ = auVar269._8_4_ * auVar155._8_4_;
                  auVar180._12_4_ = auVar269._12_4_ * auVar155._12_4_;
                  auVar88 = vsubps_avx(auVar180,auVar162);
                  auVar155 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar111 = vshufps_avx(auVar119,auVar119,0xc9);
                  auVar181._0_4_ = auVar111._0_4_ * auVar155._0_4_;
                  auVar181._4_4_ = auVar111._4_4_ * auVar155._4_4_;
                  auVar181._8_4_ = auVar111._8_4_ * auVar155._8_4_;
                  auVar181._12_4_ = auVar111._12_4_ * auVar155._12_4_;
                  auVar155 = vshufps_avx(auVar88,auVar88,0xd2);
                  auVar120._0_4_ = auVar119._0_4_ * auVar155._0_4_;
                  auVar120._4_4_ = auVar119._4_4_ * auVar155._4_4_;
                  auVar120._8_4_ = auVar119._8_4_ * auVar155._8_4_;
                  auVar120._12_4_ = auVar119._12_4_ * auVar155._12_4_;
                  auVar155 = vsubps_avx(auVar181,auVar120);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar168;
                    uVar1 = vextractps_avx(auVar155,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                    uVar1 = vextractps_avx(auVar155,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                    *(int *)(ray + k * 4 + 0xe0) = auVar155._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar169;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar74;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_790 = vshufps_avx(auVar83,auVar83,0x55);
                    auVar83 = vshufps_avx(auVar155,auVar155,0x55);
                    auStack_7b0 = vshufps_avx(auVar155,auVar155,0xaa);
                    local_7a0 = vshufps_avx(auVar155,auVar155,0);
                    local_7c0 = (RTCHitN  [16])auVar83;
                    local_780 = ZEXT816(0) << 0x20;
                    local_770 = local_7e0._0_8_;
                    uStack_768 = local_7e0._8_8_;
                    local_760 = local_7d0;
                    vcmpps_avx(ZEXT1632(local_7d0),ZEXT1632(local_7d0),0xf);
                    uStack_74c = context->user->instID[0];
                    local_750 = uStack_74c;
                    uStack_748 = uStack_74c;
                    uStack_744 = uStack_74c;
                    uVar80 = context->user->instPrimID[0];
                    auVar121._4_4_ = uVar80;
                    auVar121._0_4_ = uVar80;
                    auVar121._8_4_ = uVar80;
                    auVar121._12_4_ = uVar80;
                    auStack_740 = auVar121;
                    *(float *)(ray + k * 4 + 0x80) = fVar168;
                    local_8e0 = *local_a48;
                    local_ab0.valid = (int *)local_8e0;
                    local_ab0.geometryUserPtr = pGVar3->userPtr;
                    local_ab0.context = context->user;
                    local_ab0.hit = local_7c0;
                    local_ab0.N = 4;
                    local_ab0.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar256 = ZEXT1664(auVar84);
                      auVar314 = ZEXT1664(auVar314._0_16_);
                      auVar326 = ZEXT464((uint)fVar150);
                      auVar341 = ZEXT1664(auVar89);
                      (*pGVar3->intersectionFilterN)(&local_ab0);
                      auVar205._8_56_ = extraout_var_00;
                      auVar205._0_8_ = extraout_XMM1_Qa_00;
                      auVar121 = auVar205._0_16_;
                    }
                    if (local_8e0 == (undefined1  [16])0x0) {
                      auVar155 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar84 = vpcmpeqd_avx(auVar121,auVar121);
                      auVar155 = auVar155 ^ auVar84;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      auVar84 = vpcmpeqd_avx(auVar83,auVar83);
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar256 = ZEXT1664(auVar256._0_16_);
                        auVar314 = ZEXT1664(auVar314._0_16_);
                        auVar326 = ZEXT1664(auVar326._0_16_);
                        auVar341 = ZEXT1664(auVar341._0_16_);
                        (*p_Var4)(&local_ab0);
                        auVar84 = vpcmpeqd_avx(auVar84,auVar84);
                      }
                      auVar83 = vpcmpeqd_avx(local_8e0,_DAT_01f45a50);
                      auVar155 = auVar83 ^ auVar84;
                      if (local_8e0 != (undefined1  [16])0x0) {
                        auVar83 = auVar83 ^ auVar84;
                        auVar84 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])local_ab0.hit);
                        *(undefined1 (*) [16])(local_ab0.ray + 0xc0) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x10));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xd0) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x20));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xe0) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x30));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xf0) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x40));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x100) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x50));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x110) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x60));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x120) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x70));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x130) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x80));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x140) = auVar84;
                      }
                    }
                    auVar224 = ZEXT464((uint)fVar208);
                    auVar95._8_8_ = 0x100000001;
                    auVar95._0_8_ = 0x100000001;
                    if ((auVar95 & auVar155) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar208;
                    }
                  }
                }
              }
            }
          }
LAB_00857965:
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar309._4_4_ = uVar1;
          auVar309._0_4_ = uVar1;
          auVar309._8_4_ = uVar1;
          auVar309._12_4_ = uVar1;
          auVar309._16_4_ = uVar1;
          auVar309._20_4_ = uVar1;
          auVar309._24_4_ = uVar1;
          auVar309._28_4_ = uVar1;
          auVar310 = ZEXT3264(auVar309);
          auVar122 = vcmpps_avx(_local_9c0,auVar309,2);
          local_860 = vandps_avx(auVar122,local_860);
          fVar150 = (float)local_880._0_4_;
          fVar206 = (float)local_880._4_4_;
          fVar168 = fStack_878;
          fVar208 = fStack_874;
          fVar169 = fStack_870;
          fVar210 = fStack_86c;
          fVar170 = fStack_868;
          fVar216 = fStack_864;
        }
        auVar122 = vandps_avx(local_680,local_660);
        auVar97 = vandps_avx(local_840,_local_9e0);
        auVar147._0_4_ = fVar150 + local_400._0_4_;
        auVar147._4_4_ = fVar206 + local_400._4_4_;
        auVar147._8_4_ = fVar168 + local_400._8_4_;
        auVar147._12_4_ = fVar208 + local_400._12_4_;
        auVar147._16_4_ = fVar169 + local_400._16_4_;
        auVar147._20_4_ = fVar210 + local_400._20_4_;
        auVar147._24_4_ = fVar170 + local_400._24_4_;
        auVar147._28_4_ = fVar216 + local_400._28_4_;
        auVar155 = vshufps_avx(auVar310._0_16_,auVar310._0_16_,0);
        auVar188._16_16_ = auVar155;
        auVar188._0_16_ = auVar155;
        auVar17 = vcmpps_avx(auVar147,auVar188,2);
        auVar122 = vandps_avx(auVar17,auVar122);
        auVar203._0_4_ = fVar150 + local_3c0._0_4_;
        auVar203._4_4_ = fVar206 + local_3c0._4_4_;
        auVar203._8_4_ = fVar168 + local_3c0._8_4_;
        auVar203._12_4_ = fVar208 + local_3c0._12_4_;
        auVar203._16_4_ = fVar169 + local_3c0._16_4_;
        auVar203._20_4_ = fVar210 + local_3c0._20_4_;
        auVar203._24_4_ = fVar170 + local_3c0._24_4_;
        auVar203._28_4_ = fVar216 + local_3c0._28_4_;
        auVar205 = ZEXT3264(auVar203);
        auVar17 = vcmpps_avx(auVar203,auVar188,2);
        auVar97 = vandps_avx(auVar17,auVar97);
        auVar97 = vorps_avx(auVar122,auVar97);
        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar97 >> 0x7f,0) != '\0') ||
              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar97 >> 0xbf,0) != '\0') ||
            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar97[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar79 * 0x60) = auVar97;
          auVar122 = vblendvps_avx(_local_3c0,_local_400,auVar122);
          *(undefined1 (*) [32])(auStack_160 + uVar79 * 0x60) = auVar122;
          uVar77 = vmovlps_avx(local_630);
          (&uStack_140)[uVar79 * 0xc] = uVar77;
          auStack_138[uVar79 * 0x18] = local_c48 + 1;
          uVar79 = (ulong)((int)uVar79 + 1);
        }
      }
    }
    while( true ) {
      uVar80 = (uint)uVar79;
      if (uVar80 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar96._4_4_ = uVar1;
        auVar96._0_4_ = uVar1;
        auVar96._8_4_ = uVar1;
        auVar96._12_4_ = uVar1;
        auVar7 = vcmpps_avx(local_640,auVar96,2);
        uVar74 = vmovmskps_avx(auVar7);
        uVar74 = (uint)uVar81 & uVar74;
        goto LAB_0085514c;
      }
      uVar79 = (ulong)(uVar80 - 1);
      lVar76 = uVar79 * 0x60;
      auVar122 = *(undefined1 (*) [32])(auStack_160 + lVar76);
      auVar102._0_4_ = (float)local_880._0_4_ + auVar122._0_4_;
      auVar102._4_4_ = (float)local_880._4_4_ + auVar122._4_4_;
      auVar102._8_4_ = fStack_878 + auVar122._8_4_;
      auVar102._12_4_ = fStack_874 + auVar122._12_4_;
      auVar102._16_4_ = fStack_870 + auVar122._16_4_;
      auVar102._20_4_ = fStack_86c + auVar122._20_4_;
      auVar102._24_4_ = fStack_868 + auVar122._24_4_;
      auVar102._28_4_ = fStack_864 + auVar122._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar165._4_4_ = uVar1;
      auVar165._0_4_ = uVar1;
      auVar165._8_4_ = uVar1;
      auVar165._12_4_ = uVar1;
      auVar165._16_4_ = uVar1;
      auVar165._20_4_ = uVar1;
      auVar165._24_4_ = uVar1;
      auVar165._28_4_ = uVar1;
      auVar17 = vcmpps_avx(auVar102,auVar165,2);
      auVar97 = vandps_avx(auVar17,*(undefined1 (*) [32])(auStack_180 + lVar76));
      _local_7c0 = auVar97;
      auVar17 = *(undefined1 (*) [32])(auStack_180 + lVar76) & auVar17;
      if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0x7f,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0xbf,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar17[0x1f] < '\0') break;
      uVar79 = (ulong)(uVar80 - 1);
    }
    auVar144._8_4_ = 0x7f800000;
    auVar144._0_8_ = 0x7f8000007f800000;
    auVar144._12_4_ = 0x7f800000;
    auVar144._16_4_ = 0x7f800000;
    auVar144._20_4_ = 0x7f800000;
    auVar144._24_4_ = 0x7f800000;
    auVar144._28_4_ = 0x7f800000;
    auVar122 = vblendvps_avx(auVar144,auVar122,auVar97);
    auVar17 = vshufps_avx(auVar122,auVar122,0xb1);
    auVar17 = vminps_avx(auVar122,auVar17);
    auVar11 = vshufpd_avx(auVar17,auVar17,5);
    auVar17 = vminps_avx(auVar17,auVar11);
    auVar11 = vperm2f128_avx(auVar17,auVar17,1);
    auVar17 = vminps_avx(auVar17,auVar11);
    auVar122 = vcmpps_avx(auVar122,auVar17,0);
    auVar17 = auVar97 & auVar122;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar97 = vandps_avx(auVar122,auVar97);
    }
    auVar110._8_8_ = 0;
    auVar110._0_8_ = (&uStack_140)[uVar79 * 0xc];
    local_c48 = auStack_138[uVar79 * 0x18];
    uVar78 = vmovmskps_avx(auVar97);
    uVar75 = 0;
    if (uVar78 != 0) {
      for (; (uVar78 >> uVar75 & 1) == 0; uVar75 = uVar75 + 1) {
      }
    }
    *(undefined4 *)(local_7c0 + (ulong)uVar75 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar76) = _local_7c0;
    uVar78 = uVar80 - 1;
    if ((((((((_local_7c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7c0 >> 0x7f,0) != '\0') ||
          (_local_7c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7c0 >> 0xbf,0) != '\0') ||
        (_local_7c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7c0[0x1f] < '\0') {
      uVar78 = uVar80;
    }
    auVar155 = vshufps_avx(auVar110,auVar110,0);
    auVar84 = vshufps_avx(auVar110,auVar110,0x55);
    auVar84 = vsubps_avx(auVar84,auVar155);
    local_400._4_4_ = auVar155._4_4_ + auVar84._4_4_ * 0.14285715;
    local_400._0_4_ = auVar155._0_4_ + auVar84._0_4_ * 0.0;
    fStack_3f8 = auVar155._8_4_ + auVar84._8_4_ * 0.2857143;
    fStack_3f4 = auVar155._12_4_ + auVar84._12_4_ * 0.42857146;
    fStack_3f0 = auVar155._0_4_ + auVar84._0_4_ * 0.5714286;
    fStack_3ec = auVar155._4_4_ + auVar84._4_4_ * 0.71428573;
    fStack_3e8 = auVar155._8_4_ + auVar84._8_4_ * 0.8571429;
    fStack_3e4 = auVar155._12_4_ + auVar84._12_4_;
    local_630._8_8_ = 0;
    local_630._0_8_ = *(ulong *)(local_400 + (ulong)uVar75 * 4);
    uVar79 = (ulong)uVar78;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }